

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoding-test.c++
# Opt level: O0

void __thiscall capnp::_::anon_unknown_0::TestCase520::run(TestCase520 *this)

{
  StructDataBitCount *pSVar1;
  Reader value;
  Reader value_00;
  Reader value_01;
  Reader value_02;
  Reader value_03;
  Reader value_04;
  Reader value_05;
  Reader value_06;
  Reader value_07;
  Reader value_08;
  Reader value_09;
  Reader value_10;
  Reader value_11;
  Reader value_12;
  Reader value_13;
  Reader value_14;
  Reader value_15;
  Reader value_16;
  Reader value_17;
  Reader value_18;
  Reader value_19;
  Reader value_20;
  Reader value_21;
  Reader value_22;
  Reader value_23;
  Reader value_24;
  Reader value_25;
  Reader value_26;
  Reader value_27;
  Reader value_28;
  Reader value_29;
  Reader value_30;
  Reader value_31;
  Reader value_32;
  Reader value_33;
  Reader value_34;
  Reader value_35;
  Reader value_36;
  Reader value_37;
  Reader value_38;
  Reader value_39;
  Reader value_40;
  Reader value_41;
  Reader value_42;
  Reader value_43;
  Reader value_44;
  Reader value_45;
  Reader value_46;
  Reader value_47;
  Reader value_48;
  Reader value_49;
  Reader value_50;
  Reader value_51;
  Reader value_52;
  Reader value_53;
  Reader value_54;
  Reader value_55;
  Reader value_56;
  Reader value_57;
  Reader value_58;
  bool bVar2;
  uint uVar3;
  Builder local_2d00;
  uint local_2cd4 [2];
  bool local_2cc9;
  undefined1 local_2cc8 [7];
  bool _kj_shouldLog_119;
  bool local_2c99;
  undefined1 local_2c98 [7];
  bool _kj_shouldLog_118;
  uint local_2c6c [2];
  bool local_2c61;
  undefined1 local_2c60 [7];
  bool _kj_shouldLog_117;
  bool local_2c31;
  undefined1 local_2c30 [7];
  bool _kj_shouldLog_116;
  uint local_2c04 [2];
  bool local_2bf9;
  undefined1 local_2bf8 [7];
  bool _kj_shouldLog_115;
  bool local_2bc9;
  undefined1 local_2bc8 [7];
  bool _kj_shouldLog_114;
  uint local_2b9c [2];
  bool local_2b91;
  undefined1 local_2b90 [7];
  bool _kj_shouldLog_113;
  bool local_2b61;
  undefined1 local_2b60 [7];
  bool _kj_shouldLog_112;
  uint local_2b34 [2];
  bool local_2b29;
  undefined1 local_2b28 [7];
  bool _kj_shouldLog_111;
  bool local_2af9;
  undefined1 local_2af8 [7];
  bool _kj_shouldLog_110;
  uint local_2acc [2];
  bool local_2ac1;
  undefined1 local_2ac0 [7];
  bool _kj_shouldLog_109;
  bool local_2a91;
  undefined1 local_2a90 [7];
  bool _kj_shouldLog_108;
  uint local_2a64 [2];
  bool local_2a59;
  undefined1 local_2a58 [7];
  bool _kj_shouldLog_107;
  bool local_2a29;
  undefined1 local_2a28 [7];
  bool _kj_shouldLog_106;
  uint local_29fc [2];
  bool local_29f1;
  undefined1 local_29f0 [7];
  bool _kj_shouldLog_105;
  bool local_29c1;
  undefined1 local_29c0 [7];
  bool _kj_shouldLog_104;
  uint local_2994 [2];
  bool local_2989;
  undefined1 local_2988 [7];
  bool _kj_shouldLog_103;
  bool local_2959;
  undefined1 local_2958 [7];
  bool _kj_shouldLog_102;
  uint local_292c [2];
  bool local_2921;
  undefined1 local_2920 [7];
  bool _kj_shouldLog_101;
  bool local_28f1;
  undefined1 local_28f0 [7];
  bool _kj_shouldLog_100;
  uint local_28c4 [2];
  bool local_28b9;
  undefined1 local_28b8 [7];
  bool _kj_shouldLog_99;
  bool local_2889;
  undefined1 local_2888 [7];
  bool _kj_shouldLog_98;
  uint local_285c [2];
  bool local_2851;
  undefined1 local_2850 [7];
  bool _kj_shouldLog_97;
  bool local_2821;
  undefined1 local_2820 [7];
  bool _kj_shouldLog_96;
  uint local_27f4 [2];
  bool local_27e9;
  undefined1 local_27e8 [7];
  bool _kj_shouldLog_95;
  bool local_27b9;
  undefined1 local_27b8 [7];
  bool _kj_shouldLog_94;
  uint local_278c [2];
  bool local_2781;
  undefined1 local_2780 [7];
  bool _kj_shouldLog_93;
  bool local_2751;
  undefined1 local_2750 [7];
  bool _kj_shouldLog_92;
  uint local_2724 [2];
  bool local_2719;
  undefined1 local_2718 [7];
  bool _kj_shouldLog_91;
  bool local_26e9;
  undefined1 local_26e8 [7];
  bool _kj_shouldLog_90;
  Reader local_26c0;
  Builder local_2690;
  Reader local_2668;
  Builder local_2638;
  Reader local_2610;
  Builder local_25e0;
  Reader local_25b8;
  Builder local_2588;
  Reader local_2560;
  Builder local_2530;
  Reader local_2508;
  Builder local_24d8;
  Reader local_24b0;
  Builder local_2480;
  Reader local_2458;
  Builder local_2428;
  Reader local_2400;
  Builder local_23d0;
  Reader local_23a8;
  Builder local_2378;
  Reader local_2350;
  Builder local_2320;
  Reader local_22f8;
  Builder local_22c8;
  Reader local_22a0;
  Builder local_2270;
  Reader local_2248;
  Builder local_2218;
  Reader local_21f0;
  undefined1 local_21c0 [8];
  Builder root_3;
  MallocMessageBuilder builder_3;
  uint local_207c [2];
  bool local_2071;
  undefined1 local_2070 [7];
  bool _kj_shouldLog_89;
  bool local_2041;
  undefined1 local_2040 [7];
  bool _kj_shouldLog_88;
  uint local_2014 [2];
  bool local_2009;
  undefined1 local_2008 [7];
  bool _kj_shouldLog_87;
  bool local_1fd9;
  undefined1 local_1fd8 [7];
  bool _kj_shouldLog_86;
  uint local_1fac [2];
  bool local_1fa1;
  undefined1 local_1fa0 [7];
  bool _kj_shouldLog_85;
  bool local_1f71;
  undefined1 local_1f70 [7];
  bool _kj_shouldLog_84;
  uint local_1f44 [2];
  bool local_1f39;
  undefined1 local_1f38 [7];
  bool _kj_shouldLog_83;
  bool local_1f09;
  undefined1 local_1f08 [7];
  bool _kj_shouldLog_82;
  uint local_1edc [2];
  bool local_1ed1;
  undefined1 local_1ed0 [7];
  bool _kj_shouldLog_81;
  bool local_1ea1;
  undefined1 local_1ea0 [7];
  bool _kj_shouldLog_80;
  uint local_1e74 [2];
  bool local_1e69;
  undefined1 local_1e68 [7];
  bool _kj_shouldLog_79;
  bool local_1e39;
  undefined1 local_1e38 [7];
  bool _kj_shouldLog_78;
  uint local_1e0c [2];
  bool local_1e01;
  undefined1 local_1e00 [7];
  bool _kj_shouldLog_77;
  bool local_1dd1;
  undefined1 local_1dd0 [7];
  bool _kj_shouldLog_76;
  uint local_1da4 [2];
  bool local_1d99;
  undefined1 local_1d98 [7];
  bool _kj_shouldLog_75;
  bool local_1d69;
  undefined1 local_1d68 [7];
  bool _kj_shouldLog_74;
  uint local_1d3c [2];
  bool local_1d31;
  undefined1 local_1d30 [7];
  bool _kj_shouldLog_73;
  bool local_1d01;
  undefined1 local_1d00 [7];
  bool _kj_shouldLog_72;
  uint local_1cd4 [2];
  bool local_1cc9;
  undefined1 local_1cc8 [7];
  bool _kj_shouldLog_71;
  bool local_1c99;
  undefined1 local_1c98 [7];
  bool _kj_shouldLog_70;
  uint local_1c6c [2];
  bool local_1c61;
  undefined1 local_1c60 [7];
  bool _kj_shouldLog_69;
  bool local_1c31;
  undefined1 local_1c30 [7];
  bool _kj_shouldLog_68;
  uint local_1c04 [2];
  bool local_1bf9;
  undefined1 local_1bf8 [7];
  bool _kj_shouldLog_67;
  bool local_1bc9;
  undefined1 local_1bc8 [7];
  bool _kj_shouldLog_66;
  uint local_1b9c [2];
  bool local_1b91;
  undefined1 local_1b90 [7];
  bool _kj_shouldLog_65;
  bool local_1b61;
  undefined1 local_1b60 [7];
  bool _kj_shouldLog_64;
  uint local_1b34 [2];
  bool local_1b29;
  undefined1 local_1b28 [7];
  bool _kj_shouldLog_63;
  bool local_1af9;
  undefined1 local_1af8 [7];
  bool _kj_shouldLog_62;
  uint local_1acc [2];
  bool local_1ac1;
  undefined1 local_1ac0 [7];
  bool _kj_shouldLog_61;
  bool local_1a91;
  undefined1 auStack_1a90 [7];
  bool _kj_shouldLog_60;
  CapTableReader *pCStack_1a88;
  byte *local_1a80;
  ListElementCount LStack_1a78;
  BitsPerElementN<23> BStack_1a74;
  StructDataBitCount local_1a70;
  StructPointerCount SStack_1a6c;
  ElementSize EStack_1a6a;
  undefined1 uStack_1a69;
  int iStack_1a68;
  undefined4 uStack_1a64;
  Reader local_1a60;
  Reader local_1a30;
  Reader local_1a00;
  Reader local_19d0;
  Reader local_19a0;
  Reader local_1970;
  Reader local_1940;
  Reader local_1910;
  Reader local_18e0;
  Reader local_18b0;
  Reader local_1880;
  Reader local_1850;
  Reader local_1820;
  Reader local_17f0;
  undefined1 local_17c0 [8];
  Builder root_2;
  MallocMessageBuilder builder_2;
  uint local_167c [2];
  bool local_1671;
  undefined1 local_1670 [7];
  bool _kj_shouldLog_59;
  bool local_1641;
  undefined1 local_1640 [7];
  bool _kj_shouldLog_58;
  uint local_1614 [2];
  bool local_1609;
  undefined1 local_1608 [7];
  bool _kj_shouldLog_57;
  bool local_15d9;
  undefined1 local_15d8 [7];
  bool _kj_shouldLog_56;
  uint local_15ac [2];
  bool local_15a1;
  undefined1 local_15a0 [7];
  bool _kj_shouldLog_55;
  bool local_1571;
  undefined1 local_1570 [7];
  bool _kj_shouldLog_54;
  uint local_1544 [2];
  bool local_1539;
  undefined1 local_1538 [7];
  bool _kj_shouldLog_53;
  bool local_1509;
  undefined1 local_1508 [7];
  bool _kj_shouldLog_52;
  uint local_14dc [2];
  bool local_14d1;
  undefined1 local_14d0 [7];
  bool _kj_shouldLog_51;
  bool local_14a1;
  undefined1 local_14a0 [7];
  bool _kj_shouldLog_50;
  uint local_1474 [2];
  bool local_1469;
  undefined1 local_1468 [7];
  bool _kj_shouldLog_49;
  bool local_1439;
  undefined1 local_1438 [7];
  bool _kj_shouldLog_48;
  uint local_140c [2];
  bool local_1401;
  undefined1 local_1400 [7];
  bool _kj_shouldLog_47;
  bool local_13d1;
  undefined1 local_13d0 [7];
  bool _kj_shouldLog_46;
  uint local_13a4 [2];
  bool local_1399;
  undefined1 local_1398 [7];
  bool _kj_shouldLog_45;
  bool local_1369;
  undefined1 local_1368 [7];
  bool _kj_shouldLog_44;
  uint local_133c [2];
  bool local_1331;
  undefined1 local_1330 [7];
  bool _kj_shouldLog_43;
  bool local_1301;
  undefined1 local_1300 [7];
  bool _kj_shouldLog_42;
  uint local_12d4 [2];
  bool local_12c9;
  undefined1 local_12c8 [7];
  bool _kj_shouldLog_41;
  bool local_1299;
  undefined1 local_1298 [7];
  bool _kj_shouldLog_40;
  uint local_126c [2];
  bool local_1261;
  undefined1 local_1260 [7];
  bool _kj_shouldLog_39;
  bool local_1231;
  undefined1 local_1230 [7];
  bool _kj_shouldLog_38;
  uint local_1204 [2];
  bool local_11f9;
  undefined1 local_11f8 [7];
  bool _kj_shouldLog_37;
  bool local_11c9;
  undefined1 local_11c8 [7];
  bool _kj_shouldLog_36;
  uint local_119c [2];
  bool local_1191;
  undefined1 local_1190 [7];
  bool _kj_shouldLog_35;
  bool local_1161;
  undefined1 local_1160 [7];
  bool _kj_shouldLog_34;
  uint local_1134 [2];
  bool local_1129;
  undefined1 local_1128 [7];
  bool _kj_shouldLog_33;
  bool local_10f9;
  undefined1 local_10f8 [7];
  bool _kj_shouldLog_32;
  uint local_10cc [2];
  bool local_10c1;
  undefined1 local_10c0 [7];
  bool _kj_shouldLog_31;
  bool local_1091;
  undefined1 local_1090 [7];
  bool _kj_shouldLog_30;
  Reader local_1068;
  Builder local_1038;
  Reader local_1010;
  Builder local_fe0;
  Reader local_fb8;
  Builder local_f88;
  Reader local_f60;
  Builder local_f30;
  Reader local_f08;
  Builder local_ed8;
  Reader local_eb0;
  Builder local_e80;
  Reader local_e58;
  Builder local_e28;
  Reader local_e00;
  Builder local_dd0;
  Reader local_da8;
  Builder local_d78;
  Reader local_d50;
  Builder local_d20;
  Reader local_cf8;
  Builder local_cc8;
  Reader local_ca0;
  Builder local_c70;
  Reader local_c48;
  Builder local_c18;
  Reader local_bf0;
  Builder local_bc0;
  Reader local_b98;
  undefined1 local_b68 [8];
  Builder root_1;
  MallocMessageBuilder builder_1;
  uint local_a24 [2];
  bool local_a19;
  undefined1 local_a18 [7];
  bool _kj_shouldLog_29;
  bool local_9e9;
  undefined1 local_9e8 [7];
  bool _kj_shouldLog_28;
  uint local_9bc [2];
  bool local_9b1;
  undefined1 local_9b0 [7];
  bool _kj_shouldLog_27;
  bool local_981;
  undefined1 local_980 [7];
  bool _kj_shouldLog_26;
  uint local_954 [2];
  bool local_949;
  undefined1 local_948 [7];
  bool _kj_shouldLog_25;
  bool local_919;
  undefined1 local_918 [7];
  bool _kj_shouldLog_24;
  uint local_8ec [2];
  bool local_8e1;
  undefined1 local_8e0 [7];
  bool _kj_shouldLog_23;
  bool local_8b1;
  undefined1 local_8b0 [7];
  bool _kj_shouldLog_22;
  uint local_884 [2];
  bool local_879;
  undefined1 local_878 [7];
  bool _kj_shouldLog_21;
  bool local_849;
  undefined1 local_848 [7];
  bool _kj_shouldLog_20;
  uint local_81c [2];
  bool local_811;
  undefined1 local_810 [7];
  bool _kj_shouldLog_19;
  bool local_7e1;
  undefined1 local_7e0 [7];
  bool _kj_shouldLog_18;
  uint local_7b4 [2];
  bool local_7a9;
  undefined1 local_7a8 [7];
  bool _kj_shouldLog_17;
  bool local_779;
  undefined1 local_778 [7];
  bool _kj_shouldLog_16;
  uint local_74c [2];
  bool local_741;
  undefined1 local_740 [7];
  bool _kj_shouldLog_15;
  bool local_711;
  undefined1 local_710 [7];
  bool _kj_shouldLog_14;
  uint local_6e4 [2];
  bool local_6d9;
  undefined1 local_6d8 [7];
  bool _kj_shouldLog_13;
  bool local_6a9;
  undefined1 local_6a8 [7];
  bool _kj_shouldLog_12;
  uint local_67c [2];
  bool local_671;
  undefined1 local_670 [7];
  bool _kj_shouldLog_11;
  bool local_641;
  undefined1 local_640 [7];
  bool _kj_shouldLog_10;
  uint local_614 [2];
  bool local_609;
  undefined1 local_608 [7];
  bool _kj_shouldLog_9;
  bool local_5d9;
  undefined1 local_5d8 [7];
  bool _kj_shouldLog_8;
  uint local_5ac [2];
  bool local_5a1;
  undefined1 local_5a0 [7];
  bool _kj_shouldLog_7;
  bool local_571;
  undefined1 local_570 [7];
  bool _kj_shouldLog_6;
  uint local_544 [2];
  bool local_539;
  undefined1 local_538 [7];
  bool _kj_shouldLog_5;
  bool local_509;
  undefined1 local_508 [7];
  bool _kj_shouldLog_4;
  uint local_4dc [2];
  bool local_4d1;
  undefined1 local_4d0 [7];
  bool _kj_shouldLog_3;
  bool local_4a1;
  undefined1 local_4a0 [7];
  bool _kj_shouldLog_2;
  uint local_474 [2];
  bool local_469;
  undefined1 local_468 [7];
  bool _kj_shouldLog_1;
  bool local_439;
  undefined1 auStack_438 [7];
  bool _kj_shouldLog;
  CapTableReader *pCStack_430;
  byte *local_428;
  ListElementCount LStack_420;
  BitsPerElementN<23> BStack_41c;
  StructDataBitCount local_418;
  StructPointerCount SStack_414;
  ElementSize EStack_412;
  undefined1 uStack_411;
  int iStack_410;
  undefined4 uStack_40c;
  Reader local_408;
  Reader local_3d8;
  Reader local_3a8;
  Reader local_378;
  Reader local_348;
  Reader local_318;
  Reader local_2e8;
  Reader local_2b8;
  Reader local_288;
  Reader local_258;
  Reader local_228;
  Reader local_1f8;
  Reader local_1c8;
  Reader local_198;
  undefined1 local_168 [8];
  Reader reader;
  undefined1 local_128 [8];
  Builder root;
  MallocMessageBuilder builder;
  TestCase520 *this_local;
  
  pSVar1 = &root._builder.dataSize;
  MallocMessageBuilder::MallocMessageBuilder
            ((MallocMessageBuilder *)pSVar1,0x400,GROW_HEURISTICALLY);
  MessageBuilder::initRoot<capnproto_test::capnp::test::TestAllTypes>
            ((Builder *)local_128,(MessageBuilder *)pSVar1);
  capnproto_test::capnp::test::TestAllTypes::Builder::asReader
            ((Reader *)local_168,(Builder *)local_128);
  capnproto_test::capnp::test::TestAllTypes::Reader::getVoidList(&local_198,(Reader *)local_168);
  value.reader.capTable = local_198.reader.capTable;
  value.reader.segment = local_198.reader.segment;
  value.reader.ptr = local_198.reader.ptr;
  value.reader.elementCount = local_198.reader.elementCount;
  value.reader.step = local_198.reader.step;
  value.reader.structDataSize = local_198.reader.structDataSize;
  value.reader.structPointerCount = local_198.reader.structPointerCount;
  value.reader.elementSize = local_198.reader.elementSize;
  value.reader._39_1_ = local_198.reader._39_1_;
  value.reader.nestingLimit = local_198.reader.nestingLimit;
  value.reader._44_4_ = local_198.reader._44_4_;
  capnproto_test::capnp::test::TestAllTypes::Builder::setVoidList((Builder *)local_128,value);
  capnproto_test::capnp::test::TestAllTypes::Reader::getBoolList(&local_1c8,(Reader *)local_168);
  value_00.reader.capTable = local_1c8.reader.capTable;
  value_00.reader.segment = local_1c8.reader.segment;
  value_00.reader.ptr = local_1c8.reader.ptr;
  value_00.reader.elementCount = local_1c8.reader.elementCount;
  value_00.reader.step = local_1c8.reader.step;
  value_00.reader.structDataSize = local_1c8.reader.structDataSize;
  value_00.reader.structPointerCount = local_1c8.reader.structPointerCount;
  value_00.reader.elementSize = local_1c8.reader.elementSize;
  value_00.reader._39_1_ = local_1c8.reader._39_1_;
  value_00.reader.nestingLimit = local_1c8.reader.nestingLimit;
  value_00.reader._44_4_ = local_1c8.reader._44_4_;
  capnproto_test::capnp::test::TestAllTypes::Builder::setBoolList((Builder *)local_128,value_00);
  capnproto_test::capnp::test::TestAllTypes::Reader::getUInt8List(&local_1f8,(Reader *)local_168);
  value_01.reader.capTable = local_1f8.reader.capTable;
  value_01.reader.segment = local_1f8.reader.segment;
  value_01.reader.ptr = local_1f8.reader.ptr;
  value_01.reader.elementCount = local_1f8.reader.elementCount;
  value_01.reader.step = local_1f8.reader.step;
  value_01.reader.structDataSize = local_1f8.reader.structDataSize;
  value_01.reader.structPointerCount = local_1f8.reader.structPointerCount;
  value_01.reader.elementSize = local_1f8.reader.elementSize;
  value_01.reader._39_1_ = local_1f8.reader._39_1_;
  value_01.reader.nestingLimit = local_1f8.reader.nestingLimit;
  value_01.reader._44_4_ = local_1f8.reader._44_4_;
  capnproto_test::capnp::test::TestAllTypes::Builder::setUInt8List((Builder *)local_128,value_01);
  capnproto_test::capnp::test::TestAllTypes::Reader::getUInt16List(&local_228,(Reader *)local_168);
  value_02.reader.capTable = local_228.reader.capTable;
  value_02.reader.segment = local_228.reader.segment;
  value_02.reader.ptr = local_228.reader.ptr;
  value_02.reader.elementCount = local_228.reader.elementCount;
  value_02.reader.step = local_228.reader.step;
  value_02.reader.structDataSize = local_228.reader.structDataSize;
  value_02.reader.structPointerCount = local_228.reader.structPointerCount;
  value_02.reader.elementSize = local_228.reader.elementSize;
  value_02.reader._39_1_ = local_228.reader._39_1_;
  value_02.reader.nestingLimit = local_228.reader.nestingLimit;
  value_02.reader._44_4_ = local_228.reader._44_4_;
  capnproto_test::capnp::test::TestAllTypes::Builder::setUInt16List((Builder *)local_128,value_02);
  capnproto_test::capnp::test::TestAllTypes::Reader::getUInt32List(&local_258,(Reader *)local_168);
  value_03.reader.capTable = local_258.reader.capTable;
  value_03.reader.segment = local_258.reader.segment;
  value_03.reader.ptr = local_258.reader.ptr;
  value_03.reader.elementCount = local_258.reader.elementCount;
  value_03.reader.step = local_258.reader.step;
  value_03.reader.structDataSize = local_258.reader.structDataSize;
  value_03.reader.structPointerCount = local_258.reader.structPointerCount;
  value_03.reader.elementSize = local_258.reader.elementSize;
  value_03.reader._39_1_ = local_258.reader._39_1_;
  value_03.reader.nestingLimit = local_258.reader.nestingLimit;
  value_03.reader._44_4_ = local_258.reader._44_4_;
  capnproto_test::capnp::test::TestAllTypes::Builder::setUInt32List((Builder *)local_128,value_03);
  capnproto_test::capnp::test::TestAllTypes::Reader::getUInt64List(&local_288,(Reader *)local_168);
  value_04.reader.capTable = local_288.reader.capTable;
  value_04.reader.segment = local_288.reader.segment;
  value_04.reader.ptr = local_288.reader.ptr;
  value_04.reader.elementCount = local_288.reader.elementCount;
  value_04.reader.step = local_288.reader.step;
  value_04.reader.structDataSize = local_288.reader.structDataSize;
  value_04.reader.structPointerCount = local_288.reader.structPointerCount;
  value_04.reader.elementSize = local_288.reader.elementSize;
  value_04.reader._39_1_ = local_288.reader._39_1_;
  value_04.reader.nestingLimit = local_288.reader.nestingLimit;
  value_04.reader._44_4_ = local_288.reader._44_4_;
  capnproto_test::capnp::test::TestAllTypes::Builder::setUInt64List((Builder *)local_128,value_04);
  capnproto_test::capnp::test::TestAllTypes::Reader::getInt8List(&local_2b8,(Reader *)local_168);
  value_05.reader.capTable = local_2b8.reader.capTable;
  value_05.reader.segment = local_2b8.reader.segment;
  value_05.reader.ptr = local_2b8.reader.ptr;
  value_05.reader.elementCount = local_2b8.reader.elementCount;
  value_05.reader.step = local_2b8.reader.step;
  value_05.reader.structDataSize = local_2b8.reader.structDataSize;
  value_05.reader.structPointerCount = local_2b8.reader.structPointerCount;
  value_05.reader.elementSize = local_2b8.reader.elementSize;
  value_05.reader._39_1_ = local_2b8.reader._39_1_;
  value_05.reader.nestingLimit = local_2b8.reader.nestingLimit;
  value_05.reader._44_4_ = local_2b8.reader._44_4_;
  capnproto_test::capnp::test::TestAllTypes::Builder::setInt8List((Builder *)local_128,value_05);
  capnproto_test::capnp::test::TestAllTypes::Reader::getInt16List(&local_2e8,(Reader *)local_168);
  value_06.reader.capTable = local_2e8.reader.capTable;
  value_06.reader.segment = local_2e8.reader.segment;
  value_06.reader.ptr = local_2e8.reader.ptr;
  value_06.reader.elementCount = local_2e8.reader.elementCount;
  value_06.reader.step = local_2e8.reader.step;
  value_06.reader.structDataSize = local_2e8.reader.structDataSize;
  value_06.reader.structPointerCount = local_2e8.reader.structPointerCount;
  value_06.reader.elementSize = local_2e8.reader.elementSize;
  value_06.reader._39_1_ = local_2e8.reader._39_1_;
  value_06.reader.nestingLimit = local_2e8.reader.nestingLimit;
  value_06.reader._44_4_ = local_2e8.reader._44_4_;
  capnproto_test::capnp::test::TestAllTypes::Builder::setInt16List((Builder *)local_128,value_06);
  capnproto_test::capnp::test::TestAllTypes::Reader::getInt32List(&local_318,(Reader *)local_168);
  value_07.reader.capTable = local_318.reader.capTable;
  value_07.reader.segment = local_318.reader.segment;
  value_07.reader.ptr = local_318.reader.ptr;
  value_07.reader.elementCount = local_318.reader.elementCount;
  value_07.reader.step = local_318.reader.step;
  value_07.reader.structDataSize = local_318.reader.structDataSize;
  value_07.reader.structPointerCount = local_318.reader.structPointerCount;
  value_07.reader.elementSize = local_318.reader.elementSize;
  value_07.reader._39_1_ = local_318.reader._39_1_;
  value_07.reader.nestingLimit = local_318.reader.nestingLimit;
  value_07.reader._44_4_ = local_318.reader._44_4_;
  capnproto_test::capnp::test::TestAllTypes::Builder::setInt32List((Builder *)local_128,value_07);
  capnproto_test::capnp::test::TestAllTypes::Reader::getInt64List(&local_348,(Reader *)local_168);
  value_08.reader.capTable = local_348.reader.capTable;
  value_08.reader.segment = local_348.reader.segment;
  value_08.reader.ptr = local_348.reader.ptr;
  value_08.reader.elementCount = local_348.reader.elementCount;
  value_08.reader.step = local_348.reader.step;
  value_08.reader.structDataSize = local_348.reader.structDataSize;
  value_08.reader.structPointerCount = local_348.reader.structPointerCount;
  value_08.reader.elementSize = local_348.reader.elementSize;
  value_08.reader._39_1_ = local_348.reader._39_1_;
  value_08.reader.nestingLimit = local_348.reader.nestingLimit;
  value_08.reader._44_4_ = local_348.reader._44_4_;
  capnproto_test::capnp::test::TestAllTypes::Builder::setInt64List((Builder *)local_128,value_08);
  capnproto_test::capnp::test::TestAllTypes::Reader::getFloat32List(&local_378,(Reader *)local_168);
  value_09.reader.capTable = local_378.reader.capTable;
  value_09.reader.segment = local_378.reader.segment;
  value_09.reader.ptr = local_378.reader.ptr;
  value_09.reader.elementCount = local_378.reader.elementCount;
  value_09.reader.step = local_378.reader.step;
  value_09.reader.structDataSize = local_378.reader.structDataSize;
  value_09.reader.structPointerCount = local_378.reader.structPointerCount;
  value_09.reader.elementSize = local_378.reader.elementSize;
  value_09.reader._39_1_ = local_378.reader._39_1_;
  value_09.reader.nestingLimit = local_378.reader.nestingLimit;
  value_09.reader._44_4_ = local_378.reader._44_4_;
  capnproto_test::capnp::test::TestAllTypes::Builder::setFloat32List((Builder *)local_128,value_09);
  capnproto_test::capnp::test::TestAllTypes::Reader::getFloat64List(&local_3a8,(Reader *)local_168);
  value_10.reader.capTable = local_3a8.reader.capTable;
  value_10.reader.segment = local_3a8.reader.segment;
  value_10.reader.ptr = local_3a8.reader.ptr;
  value_10.reader.elementCount = local_3a8.reader.elementCount;
  value_10.reader.step = local_3a8.reader.step;
  value_10.reader.structDataSize = local_3a8.reader.structDataSize;
  value_10.reader.structPointerCount = local_3a8.reader.structPointerCount;
  value_10.reader.elementSize = local_3a8.reader.elementSize;
  value_10.reader._39_1_ = local_3a8.reader._39_1_;
  value_10.reader.nestingLimit = local_3a8.reader.nestingLimit;
  value_10.reader._44_4_ = local_3a8.reader._44_4_;
  capnproto_test::capnp::test::TestAllTypes::Builder::setFloat64List((Builder *)local_128,value_10);
  capnproto_test::capnp::test::TestAllTypes::Reader::getTextList(&local_3d8,(Reader *)local_168);
  value_11.reader.capTable = local_3d8.reader.capTable;
  value_11.reader.segment = local_3d8.reader.segment;
  value_11.reader.ptr = local_3d8.reader.ptr;
  value_11.reader.elementCount = local_3d8.reader.elementCount;
  value_11.reader.step = local_3d8.reader.step;
  value_11.reader.structDataSize = local_3d8.reader.structDataSize;
  value_11.reader.structPointerCount = local_3d8.reader.structPointerCount;
  value_11.reader.elementSize = local_3d8.reader.elementSize;
  value_11.reader._39_1_ = local_3d8.reader._39_1_;
  value_11.reader.nestingLimit = local_3d8.reader.nestingLimit;
  value_11.reader._44_4_ = local_3d8.reader._44_4_;
  capnproto_test::capnp::test::TestAllTypes::Builder::setTextList((Builder *)local_128,value_11);
  capnproto_test::capnp::test::TestAllTypes::Reader::getDataList(&local_408,(Reader *)local_168);
  value_12.reader.capTable = local_408.reader.capTable;
  value_12.reader.segment = local_408.reader.segment;
  value_12.reader.ptr = local_408.reader.ptr;
  value_12.reader.elementCount = local_408.reader.elementCount;
  value_12.reader.step = local_408.reader.step;
  value_12.reader.structDataSize = local_408.reader.structDataSize;
  value_12.reader.structPointerCount = local_408.reader.structPointerCount;
  value_12.reader.elementSize = local_408.reader.elementSize;
  value_12.reader._39_1_ = local_408.reader._39_1_;
  value_12.reader.nestingLimit = local_408.reader.nestingLimit;
  value_12.reader._44_4_ = local_408.reader._44_4_;
  capnproto_test::capnp::test::TestAllTypes::Builder::setDataList((Builder *)local_128,value_12);
  capnproto_test::capnp::test::TestAllTypes::Reader::getStructList
            ((Reader *)auStack_438,(Reader *)local_168);
  value_13.reader.capTable = pCStack_430;
  value_13.reader.segment = _auStack_438;
  value_13.reader.ptr = local_428;
  value_13.reader.elementCount = LStack_420;
  value_13.reader.step = BStack_41c;
  value_13.reader.structDataSize = local_418;
  value_13.reader.structPointerCount = SStack_414;
  value_13.reader.elementSize = EStack_412;
  value_13.reader._39_1_ = uStack_411;
  value_13.reader.nestingLimit = iStack_410;
  value_13.reader._44_4_ = uStack_40c;
  capnproto_test::capnp::test::TestAllTypes::Builder::setStructList((Builder *)local_128,value_13);
  bVar2 = capnproto_test::capnp::test::TestAllTypes::Builder::hasVoidList((Builder *)local_128);
  if (!bVar2) {
    local_439 = kj::_::Debug::shouldLog(ERROR);
    while (local_439 != false) {
      kj::_::Debug::log<char_const(&)[36]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
                 ,0x233,ERROR,"\"failed: expected \" \"root.hasVoidList()\"",
                 (char (*) [36])"failed: expected root.hasVoidList()");
      local_439 = false;
    }
  }
  capnproto_test::capnp::test::TestAllTypes::Builder::getVoidList
            ((Builder *)local_468,(Builder *)local_128);
  uVar3 = List<capnp::Void,_(capnp::Kind)0>::Builder::size((Builder *)local_468);
  if (uVar3 != 0) {
    local_469 = kj::_::Debug::shouldLog(ERROR);
    while (local_469 != false) {
      local_474[1] = 0;
      capnproto_test::capnp::test::TestAllTypes::Builder::getVoidList
                ((Builder *)local_4a0,(Builder *)local_128);
      local_474[0] = List<capnp::Void,_(capnp::Kind)0>::Builder::size((Builder *)local_4a0);
      kj::_::Debug::log<char_const(&)[52],int,unsigned_int>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
                 ,0x233,ERROR,
                 "\"failed: expected \" \"(0) == (root.getVoidList().size())\", 0, root.getVoidList().size()"
                 ,(char (*) [52])"failed: expected (0) == (root.getVoidList().size())",
                 (int *)(local_474 + 1),local_474);
      local_469 = false;
    }
  }
  bVar2 = capnproto_test::capnp::test::TestAllTypes::Builder::hasBoolList((Builder *)local_128);
  if (!bVar2) {
    local_4a1 = kj::_::Debug::shouldLog(ERROR);
    while (local_4a1 != false) {
      kj::_::Debug::log<char_const(&)[36]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
                 ,0x233,ERROR,"\"failed: expected \" \"root.hasBoolList()\"",
                 (char (*) [36])"failed: expected root.hasBoolList()");
      local_4a1 = false;
    }
  }
  capnproto_test::capnp::test::TestAllTypes::Builder::getBoolList
            ((Builder *)local_4d0,(Builder *)local_128);
  uVar3 = List<bool,_(capnp::Kind)0>::Builder::size((Builder *)local_4d0);
  if (uVar3 != 0) {
    local_4d1 = kj::_::Debug::shouldLog(ERROR);
    while (local_4d1 != false) {
      local_4dc[1] = 0;
      capnproto_test::capnp::test::TestAllTypes::Builder::getBoolList
                ((Builder *)local_508,(Builder *)local_128);
      local_4dc[0] = List<bool,_(capnp::Kind)0>::Builder::size((Builder *)local_508);
      kj::_::Debug::log<char_const(&)[52],int,unsigned_int>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
                 ,0x233,ERROR,
                 "\"failed: expected \" \"(0) == (root.getBoolList().size())\", 0, root.getBoolList().size()"
                 ,(char (*) [52])"failed: expected (0) == (root.getBoolList().size())",
                 (int *)(local_4dc + 1),local_4dc);
      local_4d1 = false;
    }
  }
  bVar2 = capnproto_test::capnp::test::TestAllTypes::Builder::hasUInt8List((Builder *)local_128);
  if (!bVar2) {
    local_509 = kj::_::Debug::shouldLog(ERROR);
    while (local_509 != false) {
      kj::_::Debug::log<char_const(&)[37]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
                 ,0x233,ERROR,"\"failed: expected \" \"root.hasUInt8List()\"",
                 (char (*) [37])"failed: expected root.hasUInt8List()");
      local_509 = false;
    }
  }
  capnproto_test::capnp::test::TestAllTypes::Builder::getUInt8List
            ((Builder *)local_538,(Builder *)local_128);
  uVar3 = List<unsigned_char,_(capnp::Kind)0>::Builder::size((Builder *)local_538);
  if (uVar3 != 0) {
    local_539 = kj::_::Debug::shouldLog(ERROR);
    while (local_539 != false) {
      local_544[1] = 0;
      capnproto_test::capnp::test::TestAllTypes::Builder::getUInt8List
                ((Builder *)local_570,(Builder *)local_128);
      local_544[0] = List<unsigned_char,_(capnp::Kind)0>::Builder::size((Builder *)local_570);
      kj::_::Debug::log<char_const(&)[53],int,unsigned_int>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
                 ,0x233,ERROR,
                 "\"failed: expected \" \"(0) == (root.getUInt8List().size())\", 0, root.getUInt8List().size()"
                 ,(char (*) [53])"failed: expected (0) == (root.getUInt8List().size())",
                 (int *)(local_544 + 1),local_544);
      local_539 = false;
    }
  }
  bVar2 = capnproto_test::capnp::test::TestAllTypes::Builder::hasUInt16List((Builder *)local_128);
  if (!bVar2) {
    local_571 = kj::_::Debug::shouldLog(ERROR);
    while (local_571 != false) {
      kj::_::Debug::log<char_const(&)[38]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
                 ,0x233,ERROR,"\"failed: expected \" \"root.hasUInt16List()\"",
                 (char (*) [38])"failed: expected root.hasUInt16List()");
      local_571 = false;
    }
  }
  capnproto_test::capnp::test::TestAllTypes::Builder::getUInt16List
            ((Builder *)local_5a0,(Builder *)local_128);
  uVar3 = List<unsigned_short,_(capnp::Kind)0>::Builder::size((Builder *)local_5a0);
  if (uVar3 != 0) {
    local_5a1 = kj::_::Debug::shouldLog(ERROR);
    while (local_5a1 != false) {
      local_5ac[1] = 0;
      capnproto_test::capnp::test::TestAllTypes::Builder::getUInt16List
                ((Builder *)local_5d8,(Builder *)local_128);
      local_5ac[0] = List<unsigned_short,_(capnp::Kind)0>::Builder::size((Builder *)local_5d8);
      kj::_::Debug::log<char_const(&)[54],int,unsigned_int>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
                 ,0x233,ERROR,
                 "\"failed: expected \" \"(0) == (root.getUInt16List().size())\", 0, root.getUInt16List().size()"
                 ,(char (*) [54])"failed: expected (0) == (root.getUInt16List().size())",
                 (int *)(local_5ac + 1),local_5ac);
      local_5a1 = false;
    }
  }
  bVar2 = capnproto_test::capnp::test::TestAllTypes::Builder::hasUInt32List((Builder *)local_128);
  if (!bVar2) {
    local_5d9 = kj::_::Debug::shouldLog(ERROR);
    while (local_5d9 != false) {
      kj::_::Debug::log<char_const(&)[38]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
                 ,0x233,ERROR,"\"failed: expected \" \"root.hasUInt32List()\"",
                 (char (*) [38])"failed: expected root.hasUInt32List()");
      local_5d9 = false;
    }
  }
  capnproto_test::capnp::test::TestAllTypes::Builder::getUInt32List
            ((Builder *)local_608,(Builder *)local_128);
  uVar3 = List<unsigned_int,_(capnp::Kind)0>::Builder::size((Builder *)local_608);
  if (uVar3 != 0) {
    local_609 = kj::_::Debug::shouldLog(ERROR);
    while (local_609 != false) {
      local_614[1] = 0;
      capnproto_test::capnp::test::TestAllTypes::Builder::getUInt32List
                ((Builder *)local_640,(Builder *)local_128);
      local_614[0] = List<unsigned_int,_(capnp::Kind)0>::Builder::size((Builder *)local_640);
      kj::_::Debug::log<char_const(&)[54],int,unsigned_int>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
                 ,0x233,ERROR,
                 "\"failed: expected \" \"(0) == (root.getUInt32List().size())\", 0, root.getUInt32List().size()"
                 ,(char (*) [54])"failed: expected (0) == (root.getUInt32List().size())",
                 (int *)(local_614 + 1),local_614);
      local_609 = false;
    }
  }
  bVar2 = capnproto_test::capnp::test::TestAllTypes::Builder::hasUInt64List((Builder *)local_128);
  if (!bVar2) {
    local_641 = kj::_::Debug::shouldLog(ERROR);
    while (local_641 != false) {
      kj::_::Debug::log<char_const(&)[38]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
                 ,0x233,ERROR,"\"failed: expected \" \"root.hasUInt64List()\"",
                 (char (*) [38])"failed: expected root.hasUInt64List()");
      local_641 = false;
    }
  }
  capnproto_test::capnp::test::TestAllTypes::Builder::getUInt64List
            ((Builder *)local_670,(Builder *)local_128);
  uVar3 = List<unsigned_long,_(capnp::Kind)0>::Builder::size((Builder *)local_670);
  if (uVar3 != 0) {
    local_671 = kj::_::Debug::shouldLog(ERROR);
    while (local_671 != false) {
      local_67c[1] = 0;
      capnproto_test::capnp::test::TestAllTypes::Builder::getUInt64List
                ((Builder *)local_6a8,(Builder *)local_128);
      local_67c[0] = List<unsigned_long,_(capnp::Kind)0>::Builder::size((Builder *)local_6a8);
      kj::_::Debug::log<char_const(&)[54],int,unsigned_int>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
                 ,0x233,ERROR,
                 "\"failed: expected \" \"(0) == (root.getUInt64List().size())\", 0, root.getUInt64List().size()"
                 ,(char (*) [54])"failed: expected (0) == (root.getUInt64List().size())",
                 (int *)(local_67c + 1),local_67c);
      local_671 = false;
    }
  }
  bVar2 = capnproto_test::capnp::test::TestAllTypes::Builder::hasInt8List((Builder *)local_128);
  if (!bVar2) {
    local_6a9 = kj::_::Debug::shouldLog(ERROR);
    while (local_6a9 != false) {
      kj::_::Debug::log<char_const(&)[36]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
                 ,0x233,ERROR,"\"failed: expected \" \"root.hasInt8List()\"",
                 (char (*) [36])"failed: expected root.hasInt8List()");
      local_6a9 = false;
    }
  }
  capnproto_test::capnp::test::TestAllTypes::Builder::getInt8List
            ((Builder *)local_6d8,(Builder *)local_128);
  uVar3 = List<signed_char,_(capnp::Kind)0>::Builder::size((Builder *)local_6d8);
  if (uVar3 != 0) {
    local_6d9 = kj::_::Debug::shouldLog(ERROR);
    while (local_6d9 != false) {
      local_6e4[1] = 0;
      capnproto_test::capnp::test::TestAllTypes::Builder::getInt8List
                ((Builder *)local_710,(Builder *)local_128);
      local_6e4[0] = List<signed_char,_(capnp::Kind)0>::Builder::size((Builder *)local_710);
      kj::_::Debug::log<char_const(&)[52],int,unsigned_int>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
                 ,0x233,ERROR,
                 "\"failed: expected \" \"(0) == (root.getInt8List().size())\", 0, root.getInt8List().size()"
                 ,(char (*) [52])"failed: expected (0) == (root.getInt8List().size())",
                 (int *)(local_6e4 + 1),local_6e4);
      local_6d9 = false;
    }
  }
  bVar2 = capnproto_test::capnp::test::TestAllTypes::Builder::hasInt16List((Builder *)local_128);
  if (!bVar2) {
    local_711 = kj::_::Debug::shouldLog(ERROR);
    while (local_711 != false) {
      kj::_::Debug::log<char_const(&)[37]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
                 ,0x233,ERROR,"\"failed: expected \" \"root.hasInt16List()\"",
                 (char (*) [37])"failed: expected root.hasInt16List()");
      local_711 = false;
    }
  }
  capnproto_test::capnp::test::TestAllTypes::Builder::getInt16List
            ((Builder *)local_740,(Builder *)local_128);
  uVar3 = List<short,_(capnp::Kind)0>::Builder::size((Builder *)local_740);
  if (uVar3 != 0) {
    local_741 = kj::_::Debug::shouldLog(ERROR);
    while (local_741 != false) {
      local_74c[1] = 0;
      capnproto_test::capnp::test::TestAllTypes::Builder::getInt16List
                ((Builder *)local_778,(Builder *)local_128);
      local_74c[0] = List<short,_(capnp::Kind)0>::Builder::size((Builder *)local_778);
      kj::_::Debug::log<char_const(&)[53],int,unsigned_int>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
                 ,0x233,ERROR,
                 "\"failed: expected \" \"(0) == (root.getInt16List().size())\", 0, root.getInt16List().size()"
                 ,(char (*) [53])"failed: expected (0) == (root.getInt16List().size())",
                 (int *)(local_74c + 1),local_74c);
      local_741 = false;
    }
  }
  bVar2 = capnproto_test::capnp::test::TestAllTypes::Builder::hasInt32List((Builder *)local_128);
  if (!bVar2) {
    local_779 = kj::_::Debug::shouldLog(ERROR);
    while (local_779 != false) {
      kj::_::Debug::log<char_const(&)[37]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
                 ,0x233,ERROR,"\"failed: expected \" \"root.hasInt32List()\"",
                 (char (*) [37])"failed: expected root.hasInt32List()");
      local_779 = false;
    }
  }
  capnproto_test::capnp::test::TestAllTypes::Builder::getInt32List
            ((Builder *)local_7a8,(Builder *)local_128);
  uVar3 = List<int,_(capnp::Kind)0>::Builder::size((Builder *)local_7a8);
  if (uVar3 != 0) {
    local_7a9 = kj::_::Debug::shouldLog(ERROR);
    while (local_7a9 != false) {
      local_7b4[1] = 0;
      capnproto_test::capnp::test::TestAllTypes::Builder::getInt32List
                ((Builder *)local_7e0,(Builder *)local_128);
      local_7b4[0] = List<int,_(capnp::Kind)0>::Builder::size((Builder *)local_7e0);
      kj::_::Debug::log<char_const(&)[53],int,unsigned_int>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
                 ,0x233,ERROR,
                 "\"failed: expected \" \"(0) == (root.getInt32List().size())\", 0, root.getInt32List().size()"
                 ,(char (*) [53])"failed: expected (0) == (root.getInt32List().size())",
                 (int *)(local_7b4 + 1),local_7b4);
      local_7a9 = false;
    }
  }
  bVar2 = capnproto_test::capnp::test::TestAllTypes::Builder::hasInt64List((Builder *)local_128);
  if (!bVar2) {
    local_7e1 = kj::_::Debug::shouldLog(ERROR);
    while (local_7e1 != false) {
      kj::_::Debug::log<char_const(&)[37]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
                 ,0x233,ERROR,"\"failed: expected \" \"root.hasInt64List()\"",
                 (char (*) [37])"failed: expected root.hasInt64List()");
      local_7e1 = false;
    }
  }
  capnproto_test::capnp::test::TestAllTypes::Builder::getInt64List
            ((Builder *)local_810,(Builder *)local_128);
  uVar3 = List<long,_(capnp::Kind)0>::Builder::size((Builder *)local_810);
  if (uVar3 != 0) {
    local_811 = kj::_::Debug::shouldLog(ERROR);
    while (local_811 != false) {
      local_81c[1] = 0;
      capnproto_test::capnp::test::TestAllTypes::Builder::getInt64List
                ((Builder *)local_848,(Builder *)local_128);
      local_81c[0] = List<long,_(capnp::Kind)0>::Builder::size((Builder *)local_848);
      kj::_::Debug::log<char_const(&)[53],int,unsigned_int>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
                 ,0x233,ERROR,
                 "\"failed: expected \" \"(0) == (root.getInt64List().size())\", 0, root.getInt64List().size()"
                 ,(char (*) [53])"failed: expected (0) == (root.getInt64List().size())",
                 (int *)(local_81c + 1),local_81c);
      local_811 = false;
    }
  }
  bVar2 = capnproto_test::capnp::test::TestAllTypes::Builder::hasFloat32List((Builder *)local_128);
  if (!bVar2) {
    local_849 = kj::_::Debug::shouldLog(ERROR);
    while (local_849 != false) {
      kj::_::Debug::log<char_const(&)[39]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
                 ,0x233,ERROR,"\"failed: expected \" \"root.hasFloat32List()\"",
                 (char (*) [39])"failed: expected root.hasFloat32List()");
      local_849 = false;
    }
  }
  capnproto_test::capnp::test::TestAllTypes::Builder::getFloat32List
            ((Builder *)local_878,(Builder *)local_128);
  uVar3 = List<float,_(capnp::Kind)0>::Builder::size((Builder *)local_878);
  if (uVar3 != 0) {
    local_879 = kj::_::Debug::shouldLog(ERROR);
    while (local_879 != false) {
      local_884[1] = 0;
      capnproto_test::capnp::test::TestAllTypes::Builder::getFloat32List
                ((Builder *)local_8b0,(Builder *)local_128);
      local_884[0] = List<float,_(capnp::Kind)0>::Builder::size((Builder *)local_8b0);
      kj::_::Debug::log<char_const(&)[55],int,unsigned_int>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
                 ,0x233,ERROR,
                 "\"failed: expected \" \"(0) == (root.getFloat32List().size())\", 0, root.getFloat32List().size()"
                 ,(char (*) [55])"failed: expected (0) == (root.getFloat32List().size())",
                 (int *)(local_884 + 1),local_884);
      local_879 = false;
    }
  }
  bVar2 = capnproto_test::capnp::test::TestAllTypes::Builder::hasFloat64List((Builder *)local_128);
  if (!bVar2) {
    local_8b1 = kj::_::Debug::shouldLog(ERROR);
    while (local_8b1 != false) {
      kj::_::Debug::log<char_const(&)[39]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
                 ,0x233,ERROR,"\"failed: expected \" \"root.hasFloat64List()\"",
                 (char (*) [39])"failed: expected root.hasFloat64List()");
      local_8b1 = false;
    }
  }
  capnproto_test::capnp::test::TestAllTypes::Builder::getFloat64List
            ((Builder *)local_8e0,(Builder *)local_128);
  uVar3 = List<double,_(capnp::Kind)0>::Builder::size((Builder *)local_8e0);
  if (uVar3 != 0) {
    local_8e1 = kj::_::Debug::shouldLog(ERROR);
    while (local_8e1 != false) {
      local_8ec[1] = 0;
      capnproto_test::capnp::test::TestAllTypes::Builder::getFloat64List
                ((Builder *)local_918,(Builder *)local_128);
      local_8ec[0] = List<double,_(capnp::Kind)0>::Builder::size((Builder *)local_918);
      kj::_::Debug::log<char_const(&)[55],int,unsigned_int>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
                 ,0x233,ERROR,
                 "\"failed: expected \" \"(0) == (root.getFloat64List().size())\", 0, root.getFloat64List().size()"
                 ,(char (*) [55])"failed: expected (0) == (root.getFloat64List().size())",
                 (int *)(local_8ec + 1),local_8ec);
      local_8e1 = false;
    }
  }
  bVar2 = capnproto_test::capnp::test::TestAllTypes::Builder::hasTextList((Builder *)local_128);
  if (!bVar2) {
    local_919 = kj::_::Debug::shouldLog(ERROR);
    while (local_919 != false) {
      kj::_::Debug::log<char_const(&)[36]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
                 ,0x233,ERROR,"\"failed: expected \" \"root.hasTextList()\"",
                 (char (*) [36])"failed: expected root.hasTextList()");
      local_919 = false;
    }
  }
  capnproto_test::capnp::test::TestAllTypes::Builder::getTextList
            ((Builder *)local_948,(Builder *)local_128);
  uVar3 = List<capnp::Text,_(capnp::Kind)1>::Builder::size((Builder *)local_948);
  if (uVar3 != 0) {
    local_949 = kj::_::Debug::shouldLog(ERROR);
    while (local_949 != false) {
      local_954[1] = 0;
      capnproto_test::capnp::test::TestAllTypes::Builder::getTextList
                ((Builder *)local_980,(Builder *)local_128);
      local_954[0] = List<capnp::Text,_(capnp::Kind)1>::Builder::size((Builder *)local_980);
      kj::_::Debug::log<char_const(&)[52],int,unsigned_int>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
                 ,0x233,ERROR,
                 "\"failed: expected \" \"(0) == (root.getTextList().size())\", 0, root.getTextList().size()"
                 ,(char (*) [52])"failed: expected (0) == (root.getTextList().size())",
                 (int *)(local_954 + 1),local_954);
      local_949 = false;
    }
  }
  bVar2 = capnproto_test::capnp::test::TestAllTypes::Builder::hasDataList((Builder *)local_128);
  if (!bVar2) {
    local_981 = kj::_::Debug::shouldLog(ERROR);
    while (local_981 != false) {
      kj::_::Debug::log<char_const(&)[36]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
                 ,0x233,ERROR,"\"failed: expected \" \"root.hasDataList()\"",
                 (char (*) [36])"failed: expected root.hasDataList()");
      local_981 = false;
    }
  }
  capnproto_test::capnp::test::TestAllTypes::Builder::getDataList
            ((Builder *)local_9b0,(Builder *)local_128);
  uVar3 = List<capnp::Data,_(capnp::Kind)1>::Builder::size((Builder *)local_9b0);
  if (uVar3 != 0) {
    local_9b1 = kj::_::Debug::shouldLog(ERROR);
    while (local_9b1 != false) {
      local_9bc[1] = 0;
      capnproto_test::capnp::test::TestAllTypes::Builder::getDataList
                ((Builder *)local_9e8,(Builder *)local_128);
      local_9bc[0] = List<capnp::Data,_(capnp::Kind)1>::Builder::size((Builder *)local_9e8);
      kj::_::Debug::log<char_const(&)[52],int,unsigned_int>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
                 ,0x233,ERROR,
                 "\"failed: expected \" \"(0) == (root.getDataList().size())\", 0, root.getDataList().size()"
                 ,(char (*) [52])"failed: expected (0) == (root.getDataList().size())",
                 (int *)(local_9bc + 1),local_9bc);
      local_9b1 = false;
    }
  }
  bVar2 = capnproto_test::capnp::test::TestAllTypes::Builder::hasStructList((Builder *)local_128);
  if (!bVar2) {
    local_9e9 = kj::_::Debug::shouldLog(ERROR);
    while (local_9e9 != false) {
      kj::_::Debug::log<char_const(&)[38]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
                 ,0x233,ERROR,"\"failed: expected \" \"root.hasStructList()\"",
                 (char (*) [38])"failed: expected root.hasStructList()");
      local_9e9 = false;
    }
  }
  capnproto_test::capnp::test::TestAllTypes::Builder::getStructList
            ((Builder *)local_a18,(Builder *)local_128);
  uVar3 = List<capnproto_test::capnp::test::TestAllTypes,_(capnp::Kind)3>::Builder::size
                    ((Builder *)local_a18);
  if (uVar3 != 0) {
    local_a19 = kj::_::Debug::shouldLog(ERROR);
    while (local_a19 != false) {
      local_a24[1] = 0;
      capnproto_test::capnp::test::TestAllTypes::Builder::getStructList
                ((Builder *)&builder_1.moreSegments.builder.disposer,(Builder *)local_128);
      local_a24[0] = List<capnproto_test::capnp::test::TestAllTypes,_(capnp::Kind)3>::Builder::size
                               ((Builder *)&builder_1.moreSegments.builder.disposer);
      kj::_::Debug::log<char_const(&)[54],int,unsigned_int>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
                 ,0x233,ERROR,
                 "\"failed: expected \" \"(0) == (root.getStructList().size())\", 0, root.getStructList().size()"
                 ,(char (*) [54])"failed: expected (0) == (root.getStructList().size())",
                 (int *)(local_a24 + 1),local_a24);
      local_a19 = false;
    }
  }
  MallocMessageBuilder::~MallocMessageBuilder((MallocMessageBuilder *)&root._builder.dataSize);
  pSVar1 = &root_1._builder.dataSize;
  MallocMessageBuilder::MallocMessageBuilder
            ((MallocMessageBuilder *)pSVar1,0x400,GROW_HEURISTICALLY);
  MessageBuilder::initRoot<capnproto_test::capnp::test::TestAllTypes>
            ((Builder *)local_b68,(MessageBuilder *)pSVar1);
  capnproto_test::capnp::test::TestAllTypes::Builder::getVoidList(&local_bc0,(Builder *)local_b68);
  List::Builder::operator_cast_to_Reader(&local_b98,(Builder *)&local_bc0);
  value_14.reader.capTable = local_b98.reader.capTable;
  value_14.reader.segment = local_b98.reader.segment;
  value_14.reader.ptr = local_b98.reader.ptr;
  value_14.reader.elementCount = local_b98.reader.elementCount;
  value_14.reader.step = local_b98.reader.step;
  value_14.reader.structDataSize = local_b98.reader.structDataSize;
  value_14.reader.structPointerCount = local_b98.reader.structPointerCount;
  value_14.reader.elementSize = local_b98.reader.elementSize;
  value_14.reader._39_1_ = local_b98.reader._39_1_;
  value_14.reader.nestingLimit = local_b98.reader.nestingLimit;
  value_14.reader._44_4_ = local_b98.reader._44_4_;
  capnproto_test::capnp::test::TestAllTypes::Builder::setVoidList((Builder *)local_b68,value_14);
  capnproto_test::capnp::test::TestAllTypes::Builder::getBoolList(&local_c18,(Builder *)local_b68);
  List::Builder::operator_cast_to_Reader(&local_bf0,(Builder *)&local_c18);
  value_15.reader.capTable = local_bf0.reader.capTable;
  value_15.reader.segment = local_bf0.reader.segment;
  value_15.reader.ptr = local_bf0.reader.ptr;
  value_15.reader.elementCount = local_bf0.reader.elementCount;
  value_15.reader.step = local_bf0.reader.step;
  value_15.reader.structDataSize = local_bf0.reader.structDataSize;
  value_15.reader.structPointerCount = local_bf0.reader.structPointerCount;
  value_15.reader.elementSize = local_bf0.reader.elementSize;
  value_15.reader._39_1_ = local_bf0.reader._39_1_;
  value_15.reader.nestingLimit = local_bf0.reader.nestingLimit;
  value_15.reader._44_4_ = local_bf0.reader._44_4_;
  capnproto_test::capnp::test::TestAllTypes::Builder::setBoolList((Builder *)local_b68,value_15);
  capnproto_test::capnp::test::TestAllTypes::Builder::getUInt8List(&local_c70,(Builder *)local_b68);
  List::Builder::operator_cast_to_Reader(&local_c48,(Builder *)&local_c70);
  value_16.reader.capTable = local_c48.reader.capTable;
  value_16.reader.segment = local_c48.reader.segment;
  value_16.reader.ptr = local_c48.reader.ptr;
  value_16.reader.elementCount = local_c48.reader.elementCount;
  value_16.reader.step = local_c48.reader.step;
  value_16.reader.structDataSize = local_c48.reader.structDataSize;
  value_16.reader.structPointerCount = local_c48.reader.structPointerCount;
  value_16.reader.elementSize = local_c48.reader.elementSize;
  value_16.reader._39_1_ = local_c48.reader._39_1_;
  value_16.reader.nestingLimit = local_c48.reader.nestingLimit;
  value_16.reader._44_4_ = local_c48.reader._44_4_;
  capnproto_test::capnp::test::TestAllTypes::Builder::setUInt8List((Builder *)local_b68,value_16);
  capnproto_test::capnp::test::TestAllTypes::Builder::getUInt16List(&local_cc8,(Builder *)local_b68)
  ;
  List::Builder::operator_cast_to_Reader(&local_ca0,(Builder *)&local_cc8);
  value_17.reader.capTable = local_ca0.reader.capTable;
  value_17.reader.segment = local_ca0.reader.segment;
  value_17.reader.ptr = local_ca0.reader.ptr;
  value_17.reader.elementCount = local_ca0.reader.elementCount;
  value_17.reader.step = local_ca0.reader.step;
  value_17.reader.structDataSize = local_ca0.reader.structDataSize;
  value_17.reader.structPointerCount = local_ca0.reader.structPointerCount;
  value_17.reader.elementSize = local_ca0.reader.elementSize;
  value_17.reader._39_1_ = local_ca0.reader._39_1_;
  value_17.reader.nestingLimit = local_ca0.reader.nestingLimit;
  value_17.reader._44_4_ = local_ca0.reader._44_4_;
  capnproto_test::capnp::test::TestAllTypes::Builder::setUInt16List((Builder *)local_b68,value_17);
  capnproto_test::capnp::test::TestAllTypes::Builder::getUInt32List(&local_d20,(Builder *)local_b68)
  ;
  List::Builder::operator_cast_to_Reader(&local_cf8,(Builder *)&local_d20);
  value_18.reader.capTable = local_cf8.reader.capTable;
  value_18.reader.segment = local_cf8.reader.segment;
  value_18.reader.ptr = local_cf8.reader.ptr;
  value_18.reader.elementCount = local_cf8.reader.elementCount;
  value_18.reader.step = local_cf8.reader.step;
  value_18.reader.structDataSize = local_cf8.reader.structDataSize;
  value_18.reader.structPointerCount = local_cf8.reader.structPointerCount;
  value_18.reader.elementSize = local_cf8.reader.elementSize;
  value_18.reader._39_1_ = local_cf8.reader._39_1_;
  value_18.reader.nestingLimit = local_cf8.reader.nestingLimit;
  value_18.reader._44_4_ = local_cf8.reader._44_4_;
  capnproto_test::capnp::test::TestAllTypes::Builder::setUInt32List((Builder *)local_b68,value_18);
  capnproto_test::capnp::test::TestAllTypes::Builder::getUInt64List(&local_d78,(Builder *)local_b68)
  ;
  List::Builder::operator_cast_to_Reader(&local_d50,(Builder *)&local_d78);
  value_19.reader.capTable = local_d50.reader.capTable;
  value_19.reader.segment = local_d50.reader.segment;
  value_19.reader.ptr = local_d50.reader.ptr;
  value_19.reader.elementCount = local_d50.reader.elementCount;
  value_19.reader.step = local_d50.reader.step;
  value_19.reader.structDataSize = local_d50.reader.structDataSize;
  value_19.reader.structPointerCount = local_d50.reader.structPointerCount;
  value_19.reader.elementSize = local_d50.reader.elementSize;
  value_19.reader._39_1_ = local_d50.reader._39_1_;
  value_19.reader.nestingLimit = local_d50.reader.nestingLimit;
  value_19.reader._44_4_ = local_d50.reader._44_4_;
  capnproto_test::capnp::test::TestAllTypes::Builder::setUInt64List((Builder *)local_b68,value_19);
  capnproto_test::capnp::test::TestAllTypes::Builder::getInt8List(&local_dd0,(Builder *)local_b68);
  List::Builder::operator_cast_to_Reader(&local_da8,(Builder *)&local_dd0);
  value_20.reader.capTable = local_da8.reader.capTable;
  value_20.reader.segment = local_da8.reader.segment;
  value_20.reader.ptr = local_da8.reader.ptr;
  value_20.reader.elementCount = local_da8.reader.elementCount;
  value_20.reader.step = local_da8.reader.step;
  value_20.reader.structDataSize = local_da8.reader.structDataSize;
  value_20.reader.structPointerCount = local_da8.reader.structPointerCount;
  value_20.reader.elementSize = local_da8.reader.elementSize;
  value_20.reader._39_1_ = local_da8.reader._39_1_;
  value_20.reader.nestingLimit = local_da8.reader.nestingLimit;
  value_20.reader._44_4_ = local_da8.reader._44_4_;
  capnproto_test::capnp::test::TestAllTypes::Builder::setInt8List((Builder *)local_b68,value_20);
  capnproto_test::capnp::test::TestAllTypes::Builder::getInt16List(&local_e28,(Builder *)local_b68);
  List::Builder::operator_cast_to_Reader(&local_e00,(Builder *)&local_e28);
  value_21.reader.capTable = local_e00.reader.capTable;
  value_21.reader.segment = local_e00.reader.segment;
  value_21.reader.ptr = local_e00.reader.ptr;
  value_21.reader.elementCount = local_e00.reader.elementCount;
  value_21.reader.step = local_e00.reader.step;
  value_21.reader.structDataSize = local_e00.reader.structDataSize;
  value_21.reader.structPointerCount = local_e00.reader.structPointerCount;
  value_21.reader.elementSize = local_e00.reader.elementSize;
  value_21.reader._39_1_ = local_e00.reader._39_1_;
  value_21.reader.nestingLimit = local_e00.reader.nestingLimit;
  value_21.reader._44_4_ = local_e00.reader._44_4_;
  capnproto_test::capnp::test::TestAllTypes::Builder::setInt16List((Builder *)local_b68,value_21);
  capnproto_test::capnp::test::TestAllTypes::Builder::getInt32List(&local_e80,(Builder *)local_b68);
  List::Builder::operator_cast_to_Reader(&local_e58,(Builder *)&local_e80);
  value_22.reader.capTable = local_e58.reader.capTable;
  value_22.reader.segment = local_e58.reader.segment;
  value_22.reader.ptr = local_e58.reader.ptr;
  value_22.reader.elementCount = local_e58.reader.elementCount;
  value_22.reader.step = local_e58.reader.step;
  value_22.reader.structDataSize = local_e58.reader.structDataSize;
  value_22.reader.structPointerCount = local_e58.reader.structPointerCount;
  value_22.reader.elementSize = local_e58.reader.elementSize;
  value_22.reader._39_1_ = local_e58.reader._39_1_;
  value_22.reader.nestingLimit = local_e58.reader.nestingLimit;
  value_22.reader._44_4_ = local_e58.reader._44_4_;
  capnproto_test::capnp::test::TestAllTypes::Builder::setInt32List((Builder *)local_b68,value_22);
  capnproto_test::capnp::test::TestAllTypes::Builder::getInt64List(&local_ed8,(Builder *)local_b68);
  List::Builder::operator_cast_to_Reader(&local_eb0,(Builder *)&local_ed8);
  value_23.reader.capTable = local_eb0.reader.capTable;
  value_23.reader.segment = local_eb0.reader.segment;
  value_23.reader.ptr = local_eb0.reader.ptr;
  value_23.reader.elementCount = local_eb0.reader.elementCount;
  value_23.reader.step = local_eb0.reader.step;
  value_23.reader.structDataSize = local_eb0.reader.structDataSize;
  value_23.reader.structPointerCount = local_eb0.reader.structPointerCount;
  value_23.reader.elementSize = local_eb0.reader.elementSize;
  value_23.reader._39_1_ = local_eb0.reader._39_1_;
  value_23.reader.nestingLimit = local_eb0.reader.nestingLimit;
  value_23.reader._44_4_ = local_eb0.reader._44_4_;
  capnproto_test::capnp::test::TestAllTypes::Builder::setInt64List((Builder *)local_b68,value_23);
  capnproto_test::capnp::test::TestAllTypes::Builder::getFloat32List
            (&local_f30,(Builder *)local_b68);
  List::Builder::operator_cast_to_Reader(&local_f08,(Builder *)&local_f30);
  value_24.reader.capTable = local_f08.reader.capTable;
  value_24.reader.segment = local_f08.reader.segment;
  value_24.reader.ptr = local_f08.reader.ptr;
  value_24.reader.elementCount = local_f08.reader.elementCount;
  value_24.reader.step = local_f08.reader.step;
  value_24.reader.structDataSize = local_f08.reader.structDataSize;
  value_24.reader.structPointerCount = local_f08.reader.structPointerCount;
  value_24.reader.elementSize = local_f08.reader.elementSize;
  value_24.reader._39_1_ = local_f08.reader._39_1_;
  value_24.reader.nestingLimit = local_f08.reader.nestingLimit;
  value_24.reader._44_4_ = local_f08.reader._44_4_;
  capnproto_test::capnp::test::TestAllTypes::Builder::setFloat32List((Builder *)local_b68,value_24);
  capnproto_test::capnp::test::TestAllTypes::Builder::getFloat64List
            (&local_f88,(Builder *)local_b68);
  List::Builder::operator_cast_to_Reader(&local_f60,(Builder *)&local_f88);
  value_25.reader.capTable = local_f60.reader.capTable;
  value_25.reader.segment = local_f60.reader.segment;
  value_25.reader.ptr = local_f60.reader.ptr;
  value_25.reader.elementCount = local_f60.reader.elementCount;
  value_25.reader.step = local_f60.reader.step;
  value_25.reader.structDataSize = local_f60.reader.structDataSize;
  value_25.reader.structPointerCount = local_f60.reader.structPointerCount;
  value_25.reader.elementSize = local_f60.reader.elementSize;
  value_25.reader._39_1_ = local_f60.reader._39_1_;
  value_25.reader.nestingLimit = local_f60.reader.nestingLimit;
  value_25.reader._44_4_ = local_f60.reader._44_4_;
  capnproto_test::capnp::test::TestAllTypes::Builder::setFloat64List((Builder *)local_b68,value_25);
  capnproto_test::capnp::test::TestAllTypes::Builder::getTextList(&local_fe0,(Builder *)local_b68);
  List::Builder::operator_cast_to_Reader(&local_fb8,(Builder *)&local_fe0);
  value_26.reader.capTable = local_fb8.reader.capTable;
  value_26.reader.segment = local_fb8.reader.segment;
  value_26.reader.ptr = local_fb8.reader.ptr;
  value_26.reader.elementCount = local_fb8.reader.elementCount;
  value_26.reader.step = local_fb8.reader.step;
  value_26.reader.structDataSize = local_fb8.reader.structDataSize;
  value_26.reader.structPointerCount = local_fb8.reader.structPointerCount;
  value_26.reader.elementSize = local_fb8.reader.elementSize;
  value_26.reader._39_1_ = local_fb8.reader._39_1_;
  value_26.reader.nestingLimit = local_fb8.reader.nestingLimit;
  value_26.reader._44_4_ = local_fb8.reader._44_4_;
  capnproto_test::capnp::test::TestAllTypes::Builder::setTextList((Builder *)local_b68,value_26);
  capnproto_test::capnp::test::TestAllTypes::Builder::getDataList(&local_1038,(Builder *)local_b68);
  List::Builder::operator_cast_to_Reader(&local_1010,(Builder *)&local_1038);
  value_27.reader.capTable = local_1010.reader.capTable;
  value_27.reader.segment = local_1010.reader.segment;
  value_27.reader.ptr = local_1010.reader.ptr;
  value_27.reader.elementCount = local_1010.reader.elementCount;
  value_27.reader.step = local_1010.reader.step;
  value_27.reader.structDataSize = local_1010.reader.structDataSize;
  value_27.reader.structPointerCount = local_1010.reader.structPointerCount;
  value_27.reader.elementSize = local_1010.reader.elementSize;
  value_27.reader._39_1_ = local_1010.reader._39_1_;
  value_27.reader.nestingLimit = local_1010.reader.nestingLimit;
  value_27.reader._44_4_ = local_1010.reader._44_4_;
  capnproto_test::capnp::test::TestAllTypes::Builder::setDataList((Builder *)local_b68,value_27);
  capnproto_test::capnp::test::TestAllTypes::Builder::getStructList
            ((Builder *)local_1090,(Builder *)local_b68);
  List::Builder::operator_cast_to_Reader(&local_1068,(Builder *)local_1090);
  value_28.reader.capTable = local_1068.reader.capTable;
  value_28.reader.segment = local_1068.reader.segment;
  value_28.reader.ptr = local_1068.reader.ptr;
  value_28.reader.elementCount = local_1068.reader.elementCount;
  value_28.reader.step = local_1068.reader.step;
  value_28.reader.structDataSize = local_1068.reader.structDataSize;
  value_28.reader.structPointerCount = local_1068.reader.structPointerCount;
  value_28.reader.elementSize = local_1068.reader.elementSize;
  value_28.reader._39_1_ = local_1068.reader._39_1_;
  value_28.reader.nestingLimit = local_1068.reader.nestingLimit;
  value_28.reader._44_4_ = local_1068.reader._44_4_;
  capnproto_test::capnp::test::TestAllTypes::Builder::setStructList((Builder *)local_b68,value_28);
  bVar2 = capnproto_test::capnp::test::TestAllTypes::Builder::hasVoidList((Builder *)local_b68);
  if (!bVar2) {
    local_1091 = kj::_::Debug::shouldLog(ERROR);
    while (local_1091 != false) {
      kj::_::Debug::log<char_const(&)[36]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
                 ,0x23a,ERROR,"\"failed: expected \" \"root.hasVoidList()\"",
                 (char (*) [36])"failed: expected root.hasVoidList()");
      local_1091 = false;
    }
  }
  capnproto_test::capnp::test::TestAllTypes::Builder::getVoidList
            ((Builder *)local_10c0,(Builder *)local_b68);
  uVar3 = List<capnp::Void,_(capnp::Kind)0>::Builder::size((Builder *)local_10c0);
  if (uVar3 != 0) {
    local_10c1 = kj::_::Debug::shouldLog(ERROR);
    while (local_10c1 != false) {
      local_10cc[1] = 0;
      capnproto_test::capnp::test::TestAllTypes::Builder::getVoidList
                ((Builder *)local_10f8,(Builder *)local_b68);
      local_10cc[0] = List<capnp::Void,_(capnp::Kind)0>::Builder::size((Builder *)local_10f8);
      kj::_::Debug::log<char_const(&)[52],int,unsigned_int>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
                 ,0x23a,ERROR,
                 "\"failed: expected \" \"(0) == (root.getVoidList().size())\", 0, root.getVoidList().size()"
                 ,(char (*) [52])"failed: expected (0) == (root.getVoidList().size())",
                 (int *)(local_10cc + 1),local_10cc);
      local_10c1 = false;
    }
  }
  bVar2 = capnproto_test::capnp::test::TestAllTypes::Builder::hasBoolList((Builder *)local_b68);
  if (!bVar2) {
    local_10f9 = kj::_::Debug::shouldLog(ERROR);
    while (local_10f9 != false) {
      kj::_::Debug::log<char_const(&)[36]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
                 ,0x23a,ERROR,"\"failed: expected \" \"root.hasBoolList()\"",
                 (char (*) [36])"failed: expected root.hasBoolList()");
      local_10f9 = false;
    }
  }
  capnproto_test::capnp::test::TestAllTypes::Builder::getBoolList
            ((Builder *)local_1128,(Builder *)local_b68);
  uVar3 = List<bool,_(capnp::Kind)0>::Builder::size((Builder *)local_1128);
  if (uVar3 != 0) {
    local_1129 = kj::_::Debug::shouldLog(ERROR);
    while (local_1129 != false) {
      local_1134[1] = 0;
      capnproto_test::capnp::test::TestAllTypes::Builder::getBoolList
                ((Builder *)local_1160,(Builder *)local_b68);
      local_1134[0] = List<bool,_(capnp::Kind)0>::Builder::size((Builder *)local_1160);
      kj::_::Debug::log<char_const(&)[52],int,unsigned_int>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
                 ,0x23a,ERROR,
                 "\"failed: expected \" \"(0) == (root.getBoolList().size())\", 0, root.getBoolList().size()"
                 ,(char (*) [52])"failed: expected (0) == (root.getBoolList().size())",
                 (int *)(local_1134 + 1),local_1134);
      local_1129 = false;
    }
  }
  bVar2 = capnproto_test::capnp::test::TestAllTypes::Builder::hasUInt8List((Builder *)local_b68);
  if (!bVar2) {
    local_1161 = kj::_::Debug::shouldLog(ERROR);
    while (local_1161 != false) {
      kj::_::Debug::log<char_const(&)[37]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
                 ,0x23a,ERROR,"\"failed: expected \" \"root.hasUInt8List()\"",
                 (char (*) [37])"failed: expected root.hasUInt8List()");
      local_1161 = false;
    }
  }
  capnproto_test::capnp::test::TestAllTypes::Builder::getUInt8List
            ((Builder *)local_1190,(Builder *)local_b68);
  uVar3 = List<unsigned_char,_(capnp::Kind)0>::Builder::size((Builder *)local_1190);
  if (uVar3 != 0) {
    local_1191 = kj::_::Debug::shouldLog(ERROR);
    while (local_1191 != false) {
      local_119c[1] = 0;
      capnproto_test::capnp::test::TestAllTypes::Builder::getUInt8List
                ((Builder *)local_11c8,(Builder *)local_b68);
      local_119c[0] = List<unsigned_char,_(capnp::Kind)0>::Builder::size((Builder *)local_11c8);
      kj::_::Debug::log<char_const(&)[53],int,unsigned_int>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
                 ,0x23a,ERROR,
                 "\"failed: expected \" \"(0) == (root.getUInt8List().size())\", 0, root.getUInt8List().size()"
                 ,(char (*) [53])"failed: expected (0) == (root.getUInt8List().size())",
                 (int *)(local_119c + 1),local_119c);
      local_1191 = false;
    }
  }
  bVar2 = capnproto_test::capnp::test::TestAllTypes::Builder::hasUInt16List((Builder *)local_b68);
  if (!bVar2) {
    local_11c9 = kj::_::Debug::shouldLog(ERROR);
    while (local_11c9 != false) {
      kj::_::Debug::log<char_const(&)[38]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
                 ,0x23a,ERROR,"\"failed: expected \" \"root.hasUInt16List()\"",
                 (char (*) [38])"failed: expected root.hasUInt16List()");
      local_11c9 = false;
    }
  }
  capnproto_test::capnp::test::TestAllTypes::Builder::getUInt16List
            ((Builder *)local_11f8,(Builder *)local_b68);
  uVar3 = List<unsigned_short,_(capnp::Kind)0>::Builder::size((Builder *)local_11f8);
  if (uVar3 != 0) {
    local_11f9 = kj::_::Debug::shouldLog(ERROR);
    while (local_11f9 != false) {
      local_1204[1] = 0;
      capnproto_test::capnp::test::TestAllTypes::Builder::getUInt16List
                ((Builder *)local_1230,(Builder *)local_b68);
      local_1204[0] = List<unsigned_short,_(capnp::Kind)0>::Builder::size((Builder *)local_1230);
      kj::_::Debug::log<char_const(&)[54],int,unsigned_int>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
                 ,0x23a,ERROR,
                 "\"failed: expected \" \"(0) == (root.getUInt16List().size())\", 0, root.getUInt16List().size()"
                 ,(char (*) [54])"failed: expected (0) == (root.getUInt16List().size())",
                 (int *)(local_1204 + 1),local_1204);
      local_11f9 = false;
    }
  }
  bVar2 = capnproto_test::capnp::test::TestAllTypes::Builder::hasUInt32List((Builder *)local_b68);
  if (!bVar2) {
    local_1231 = kj::_::Debug::shouldLog(ERROR);
    while (local_1231 != false) {
      kj::_::Debug::log<char_const(&)[38]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
                 ,0x23a,ERROR,"\"failed: expected \" \"root.hasUInt32List()\"",
                 (char (*) [38])"failed: expected root.hasUInt32List()");
      local_1231 = false;
    }
  }
  capnproto_test::capnp::test::TestAllTypes::Builder::getUInt32List
            ((Builder *)local_1260,(Builder *)local_b68);
  uVar3 = List<unsigned_int,_(capnp::Kind)0>::Builder::size((Builder *)local_1260);
  if (uVar3 != 0) {
    local_1261 = kj::_::Debug::shouldLog(ERROR);
    while (local_1261 != false) {
      local_126c[1] = 0;
      capnproto_test::capnp::test::TestAllTypes::Builder::getUInt32List
                ((Builder *)local_1298,(Builder *)local_b68);
      local_126c[0] = List<unsigned_int,_(capnp::Kind)0>::Builder::size((Builder *)local_1298);
      kj::_::Debug::log<char_const(&)[54],int,unsigned_int>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
                 ,0x23a,ERROR,
                 "\"failed: expected \" \"(0) == (root.getUInt32List().size())\", 0, root.getUInt32List().size()"
                 ,(char (*) [54])"failed: expected (0) == (root.getUInt32List().size())",
                 (int *)(local_126c + 1),local_126c);
      local_1261 = false;
    }
  }
  bVar2 = capnproto_test::capnp::test::TestAllTypes::Builder::hasUInt64List((Builder *)local_b68);
  if (!bVar2) {
    local_1299 = kj::_::Debug::shouldLog(ERROR);
    while (local_1299 != false) {
      kj::_::Debug::log<char_const(&)[38]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
                 ,0x23a,ERROR,"\"failed: expected \" \"root.hasUInt64List()\"",
                 (char (*) [38])"failed: expected root.hasUInt64List()");
      local_1299 = false;
    }
  }
  capnproto_test::capnp::test::TestAllTypes::Builder::getUInt64List
            ((Builder *)local_12c8,(Builder *)local_b68);
  uVar3 = List<unsigned_long,_(capnp::Kind)0>::Builder::size((Builder *)local_12c8);
  if (uVar3 != 0) {
    local_12c9 = kj::_::Debug::shouldLog(ERROR);
    while (local_12c9 != false) {
      local_12d4[1] = 0;
      capnproto_test::capnp::test::TestAllTypes::Builder::getUInt64List
                ((Builder *)local_1300,(Builder *)local_b68);
      local_12d4[0] = List<unsigned_long,_(capnp::Kind)0>::Builder::size((Builder *)local_1300);
      kj::_::Debug::log<char_const(&)[54],int,unsigned_int>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
                 ,0x23a,ERROR,
                 "\"failed: expected \" \"(0) == (root.getUInt64List().size())\", 0, root.getUInt64List().size()"
                 ,(char (*) [54])"failed: expected (0) == (root.getUInt64List().size())",
                 (int *)(local_12d4 + 1),local_12d4);
      local_12c9 = false;
    }
  }
  bVar2 = capnproto_test::capnp::test::TestAllTypes::Builder::hasInt8List((Builder *)local_b68);
  if (!bVar2) {
    local_1301 = kj::_::Debug::shouldLog(ERROR);
    while (local_1301 != false) {
      kj::_::Debug::log<char_const(&)[36]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
                 ,0x23a,ERROR,"\"failed: expected \" \"root.hasInt8List()\"",
                 (char (*) [36])"failed: expected root.hasInt8List()");
      local_1301 = false;
    }
  }
  capnproto_test::capnp::test::TestAllTypes::Builder::getInt8List
            ((Builder *)local_1330,(Builder *)local_b68);
  uVar3 = List<signed_char,_(capnp::Kind)0>::Builder::size((Builder *)local_1330);
  if (uVar3 != 0) {
    local_1331 = kj::_::Debug::shouldLog(ERROR);
    while (local_1331 != false) {
      local_133c[1] = 0;
      capnproto_test::capnp::test::TestAllTypes::Builder::getInt8List
                ((Builder *)local_1368,(Builder *)local_b68);
      local_133c[0] = List<signed_char,_(capnp::Kind)0>::Builder::size((Builder *)local_1368);
      kj::_::Debug::log<char_const(&)[52],int,unsigned_int>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
                 ,0x23a,ERROR,
                 "\"failed: expected \" \"(0) == (root.getInt8List().size())\", 0, root.getInt8List().size()"
                 ,(char (*) [52])"failed: expected (0) == (root.getInt8List().size())",
                 (int *)(local_133c + 1),local_133c);
      local_1331 = false;
    }
  }
  bVar2 = capnproto_test::capnp::test::TestAllTypes::Builder::hasInt16List((Builder *)local_b68);
  if (!bVar2) {
    local_1369 = kj::_::Debug::shouldLog(ERROR);
    while (local_1369 != false) {
      kj::_::Debug::log<char_const(&)[37]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
                 ,0x23a,ERROR,"\"failed: expected \" \"root.hasInt16List()\"",
                 (char (*) [37])"failed: expected root.hasInt16List()");
      local_1369 = false;
    }
  }
  capnproto_test::capnp::test::TestAllTypes::Builder::getInt16List
            ((Builder *)local_1398,(Builder *)local_b68);
  uVar3 = List<short,_(capnp::Kind)0>::Builder::size((Builder *)local_1398);
  if (uVar3 != 0) {
    local_1399 = kj::_::Debug::shouldLog(ERROR);
    while (local_1399 != false) {
      local_13a4[1] = 0;
      capnproto_test::capnp::test::TestAllTypes::Builder::getInt16List
                ((Builder *)local_13d0,(Builder *)local_b68);
      local_13a4[0] = List<short,_(capnp::Kind)0>::Builder::size((Builder *)local_13d0);
      kj::_::Debug::log<char_const(&)[53],int,unsigned_int>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
                 ,0x23a,ERROR,
                 "\"failed: expected \" \"(0) == (root.getInt16List().size())\", 0, root.getInt16List().size()"
                 ,(char (*) [53])"failed: expected (0) == (root.getInt16List().size())",
                 (int *)(local_13a4 + 1),local_13a4);
      local_1399 = false;
    }
  }
  bVar2 = capnproto_test::capnp::test::TestAllTypes::Builder::hasInt32List((Builder *)local_b68);
  if (!bVar2) {
    local_13d1 = kj::_::Debug::shouldLog(ERROR);
    while (local_13d1 != false) {
      kj::_::Debug::log<char_const(&)[37]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
                 ,0x23a,ERROR,"\"failed: expected \" \"root.hasInt32List()\"",
                 (char (*) [37])"failed: expected root.hasInt32List()");
      local_13d1 = false;
    }
  }
  capnproto_test::capnp::test::TestAllTypes::Builder::getInt32List
            ((Builder *)local_1400,(Builder *)local_b68);
  uVar3 = List<int,_(capnp::Kind)0>::Builder::size((Builder *)local_1400);
  if (uVar3 != 0) {
    local_1401 = kj::_::Debug::shouldLog(ERROR);
    while (local_1401 != false) {
      local_140c[1] = 0;
      capnproto_test::capnp::test::TestAllTypes::Builder::getInt32List
                ((Builder *)local_1438,(Builder *)local_b68);
      local_140c[0] = List<int,_(capnp::Kind)0>::Builder::size((Builder *)local_1438);
      kj::_::Debug::log<char_const(&)[53],int,unsigned_int>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
                 ,0x23a,ERROR,
                 "\"failed: expected \" \"(0) == (root.getInt32List().size())\", 0, root.getInt32List().size()"
                 ,(char (*) [53])"failed: expected (0) == (root.getInt32List().size())",
                 (int *)(local_140c + 1),local_140c);
      local_1401 = false;
    }
  }
  bVar2 = capnproto_test::capnp::test::TestAllTypes::Builder::hasInt64List((Builder *)local_b68);
  if (!bVar2) {
    local_1439 = kj::_::Debug::shouldLog(ERROR);
    while (local_1439 != false) {
      kj::_::Debug::log<char_const(&)[37]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
                 ,0x23a,ERROR,"\"failed: expected \" \"root.hasInt64List()\"",
                 (char (*) [37])"failed: expected root.hasInt64List()");
      local_1439 = false;
    }
  }
  capnproto_test::capnp::test::TestAllTypes::Builder::getInt64List
            ((Builder *)local_1468,(Builder *)local_b68);
  uVar3 = List<long,_(capnp::Kind)0>::Builder::size((Builder *)local_1468);
  if (uVar3 != 0) {
    local_1469 = kj::_::Debug::shouldLog(ERROR);
    while (local_1469 != false) {
      local_1474[1] = 0;
      capnproto_test::capnp::test::TestAllTypes::Builder::getInt64List
                ((Builder *)local_14a0,(Builder *)local_b68);
      local_1474[0] = List<long,_(capnp::Kind)0>::Builder::size((Builder *)local_14a0);
      kj::_::Debug::log<char_const(&)[53],int,unsigned_int>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
                 ,0x23a,ERROR,
                 "\"failed: expected \" \"(0) == (root.getInt64List().size())\", 0, root.getInt64List().size()"
                 ,(char (*) [53])"failed: expected (0) == (root.getInt64List().size())",
                 (int *)(local_1474 + 1),local_1474);
      local_1469 = false;
    }
  }
  bVar2 = capnproto_test::capnp::test::TestAllTypes::Builder::hasFloat32List((Builder *)local_b68);
  if (!bVar2) {
    local_14a1 = kj::_::Debug::shouldLog(ERROR);
    while (local_14a1 != false) {
      kj::_::Debug::log<char_const(&)[39]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
                 ,0x23a,ERROR,"\"failed: expected \" \"root.hasFloat32List()\"",
                 (char (*) [39])"failed: expected root.hasFloat32List()");
      local_14a1 = false;
    }
  }
  capnproto_test::capnp::test::TestAllTypes::Builder::getFloat32List
            ((Builder *)local_14d0,(Builder *)local_b68);
  uVar3 = List<float,_(capnp::Kind)0>::Builder::size((Builder *)local_14d0);
  if (uVar3 != 0) {
    local_14d1 = kj::_::Debug::shouldLog(ERROR);
    while (local_14d1 != false) {
      local_14dc[1] = 0;
      capnproto_test::capnp::test::TestAllTypes::Builder::getFloat32List
                ((Builder *)local_1508,(Builder *)local_b68);
      local_14dc[0] = List<float,_(capnp::Kind)0>::Builder::size((Builder *)local_1508);
      kj::_::Debug::log<char_const(&)[55],int,unsigned_int>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
                 ,0x23a,ERROR,
                 "\"failed: expected \" \"(0) == (root.getFloat32List().size())\", 0, root.getFloat32List().size()"
                 ,(char (*) [55])"failed: expected (0) == (root.getFloat32List().size())",
                 (int *)(local_14dc + 1),local_14dc);
      local_14d1 = false;
    }
  }
  bVar2 = capnproto_test::capnp::test::TestAllTypes::Builder::hasFloat64List((Builder *)local_b68);
  if (!bVar2) {
    local_1509 = kj::_::Debug::shouldLog(ERROR);
    while (local_1509 != false) {
      kj::_::Debug::log<char_const(&)[39]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
                 ,0x23a,ERROR,"\"failed: expected \" \"root.hasFloat64List()\"",
                 (char (*) [39])"failed: expected root.hasFloat64List()");
      local_1509 = false;
    }
  }
  capnproto_test::capnp::test::TestAllTypes::Builder::getFloat64List
            ((Builder *)local_1538,(Builder *)local_b68);
  uVar3 = List<double,_(capnp::Kind)0>::Builder::size((Builder *)local_1538);
  if (uVar3 != 0) {
    local_1539 = kj::_::Debug::shouldLog(ERROR);
    while (local_1539 != false) {
      local_1544[1] = 0;
      capnproto_test::capnp::test::TestAllTypes::Builder::getFloat64List
                ((Builder *)local_1570,(Builder *)local_b68);
      local_1544[0] = List<double,_(capnp::Kind)0>::Builder::size((Builder *)local_1570);
      kj::_::Debug::log<char_const(&)[55],int,unsigned_int>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
                 ,0x23a,ERROR,
                 "\"failed: expected \" \"(0) == (root.getFloat64List().size())\", 0, root.getFloat64List().size()"
                 ,(char (*) [55])"failed: expected (0) == (root.getFloat64List().size())",
                 (int *)(local_1544 + 1),local_1544);
      local_1539 = false;
    }
  }
  bVar2 = capnproto_test::capnp::test::TestAllTypes::Builder::hasTextList((Builder *)local_b68);
  if (!bVar2) {
    local_1571 = kj::_::Debug::shouldLog(ERROR);
    while (local_1571 != false) {
      kj::_::Debug::log<char_const(&)[36]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
                 ,0x23a,ERROR,"\"failed: expected \" \"root.hasTextList()\"",
                 (char (*) [36])"failed: expected root.hasTextList()");
      local_1571 = false;
    }
  }
  capnproto_test::capnp::test::TestAllTypes::Builder::getTextList
            ((Builder *)local_15a0,(Builder *)local_b68);
  uVar3 = List<capnp::Text,_(capnp::Kind)1>::Builder::size((Builder *)local_15a0);
  if (uVar3 != 0) {
    local_15a1 = kj::_::Debug::shouldLog(ERROR);
    while (local_15a1 != false) {
      local_15ac[1] = 0;
      capnproto_test::capnp::test::TestAllTypes::Builder::getTextList
                ((Builder *)local_15d8,(Builder *)local_b68);
      local_15ac[0] = List<capnp::Text,_(capnp::Kind)1>::Builder::size((Builder *)local_15d8);
      kj::_::Debug::log<char_const(&)[52],int,unsigned_int>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
                 ,0x23a,ERROR,
                 "\"failed: expected \" \"(0) == (root.getTextList().size())\", 0, root.getTextList().size()"
                 ,(char (*) [52])"failed: expected (0) == (root.getTextList().size())",
                 (int *)(local_15ac + 1),local_15ac);
      local_15a1 = false;
    }
  }
  bVar2 = capnproto_test::capnp::test::TestAllTypes::Builder::hasDataList((Builder *)local_b68);
  if (!bVar2) {
    local_15d9 = kj::_::Debug::shouldLog(ERROR);
    while (local_15d9 != false) {
      kj::_::Debug::log<char_const(&)[36]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
                 ,0x23a,ERROR,"\"failed: expected \" \"root.hasDataList()\"",
                 (char (*) [36])"failed: expected root.hasDataList()");
      local_15d9 = false;
    }
  }
  capnproto_test::capnp::test::TestAllTypes::Builder::getDataList
            ((Builder *)local_1608,(Builder *)local_b68);
  uVar3 = List<capnp::Data,_(capnp::Kind)1>::Builder::size((Builder *)local_1608);
  if (uVar3 != 0) {
    local_1609 = kj::_::Debug::shouldLog(ERROR);
    while (local_1609 != false) {
      local_1614[1] = 0;
      capnproto_test::capnp::test::TestAllTypes::Builder::getDataList
                ((Builder *)local_1640,(Builder *)local_b68);
      local_1614[0] = List<capnp::Data,_(capnp::Kind)1>::Builder::size((Builder *)local_1640);
      kj::_::Debug::log<char_const(&)[52],int,unsigned_int>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
                 ,0x23a,ERROR,
                 "\"failed: expected \" \"(0) == (root.getDataList().size())\", 0, root.getDataList().size()"
                 ,(char (*) [52])"failed: expected (0) == (root.getDataList().size())",
                 (int *)(local_1614 + 1),local_1614);
      local_1609 = false;
    }
  }
  bVar2 = capnproto_test::capnp::test::TestAllTypes::Builder::hasStructList((Builder *)local_b68);
  if (!bVar2) {
    local_1641 = kj::_::Debug::shouldLog(ERROR);
    while (local_1641 != false) {
      kj::_::Debug::log<char_const(&)[38]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
                 ,0x23a,ERROR,"\"failed: expected \" \"root.hasStructList()\"",
                 (char (*) [38])"failed: expected root.hasStructList()");
      local_1641 = false;
    }
  }
  capnproto_test::capnp::test::TestAllTypes::Builder::getStructList
            ((Builder *)local_1670,(Builder *)local_b68);
  uVar3 = List<capnproto_test::capnp::test::TestAllTypes,_(capnp::Kind)3>::Builder::size
                    ((Builder *)local_1670);
  if (uVar3 != 0) {
    local_1671 = kj::_::Debug::shouldLog(ERROR);
    while (local_1671 != false) {
      local_167c[1] = 0;
      capnproto_test::capnp::test::TestAllTypes::Builder::getStructList
                ((Builder *)&builder_2.moreSegments.builder.disposer,(Builder *)local_b68);
      local_167c[0] =
           List<capnproto_test::capnp::test::TestAllTypes,_(capnp::Kind)3>::Builder::size
                     ((Builder *)&builder_2.moreSegments.builder.disposer);
      kj::_::Debug::log<char_const(&)[54],int,unsigned_int>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
                 ,0x23a,ERROR,
                 "\"failed: expected \" \"(0) == (root.getStructList().size())\", 0, root.getStructList().size()"
                 ,(char (*) [54])"failed: expected (0) == (root.getStructList().size())",
                 (int *)(local_167c + 1),local_167c);
      local_1671 = false;
    }
  }
  MallocMessageBuilder::~MallocMessageBuilder((MallocMessageBuilder *)&root_1._builder.dataSize);
  pSVar1 = &root_2._builder.dataSize;
  MallocMessageBuilder::MallocMessageBuilder
            ((MallocMessageBuilder *)pSVar1,0x400,GROW_HEURISTICALLY);
  MessageBuilder::initRoot<capnproto_test::capnp::test::TestAllTypes>
            ((Builder *)local_17c0,(MessageBuilder *)pSVar1);
  List<capnp::Void,_(capnp::Kind)0>::Reader::Reader(&local_17f0);
  value_29.reader.capTable = local_17f0.reader.capTable;
  value_29.reader.segment = local_17f0.reader.segment;
  value_29.reader.ptr = local_17f0.reader.ptr;
  value_29.reader.elementCount = local_17f0.reader.elementCount;
  value_29.reader.step = local_17f0.reader.step;
  value_29.reader.structDataSize = local_17f0.reader.structDataSize;
  value_29.reader.structPointerCount = local_17f0.reader.structPointerCount;
  value_29.reader.elementSize = local_17f0.reader.elementSize;
  value_29.reader._39_1_ = local_17f0.reader._39_1_;
  value_29.reader.nestingLimit = local_17f0.reader.nestingLimit;
  value_29.reader._44_4_ = local_17f0.reader._44_4_;
  capnproto_test::capnp::test::TestAllTypes::Builder::setVoidList((Builder *)local_17c0,value_29);
  List<bool,_(capnp::Kind)0>::Reader::Reader(&local_1820);
  value_30.reader.capTable = local_1820.reader.capTable;
  value_30.reader.segment = local_1820.reader.segment;
  value_30.reader.ptr = local_1820.reader.ptr;
  value_30.reader.elementCount = local_1820.reader.elementCount;
  value_30.reader.step = local_1820.reader.step;
  value_30.reader.structDataSize = local_1820.reader.structDataSize;
  value_30.reader.structPointerCount = local_1820.reader.structPointerCount;
  value_30.reader.elementSize = local_1820.reader.elementSize;
  value_30.reader._39_1_ = local_1820.reader._39_1_;
  value_30.reader.nestingLimit = local_1820.reader.nestingLimit;
  value_30.reader._44_4_ = local_1820.reader._44_4_;
  capnproto_test::capnp::test::TestAllTypes::Builder::setBoolList((Builder *)local_17c0,value_30);
  List<unsigned_char,_(capnp::Kind)0>::Reader::Reader(&local_1850);
  value_31.reader.capTable = local_1850.reader.capTable;
  value_31.reader.segment = local_1850.reader.segment;
  value_31.reader.ptr = local_1850.reader.ptr;
  value_31.reader.elementCount = local_1850.reader.elementCount;
  value_31.reader.step = local_1850.reader.step;
  value_31.reader.structDataSize = local_1850.reader.structDataSize;
  value_31.reader.structPointerCount = local_1850.reader.structPointerCount;
  value_31.reader.elementSize = local_1850.reader.elementSize;
  value_31.reader._39_1_ = local_1850.reader._39_1_;
  value_31.reader.nestingLimit = local_1850.reader.nestingLimit;
  value_31.reader._44_4_ = local_1850.reader._44_4_;
  capnproto_test::capnp::test::TestAllTypes::Builder::setUInt8List((Builder *)local_17c0,value_31);
  List<unsigned_short,_(capnp::Kind)0>::Reader::Reader(&local_1880);
  value_32.reader.capTable = local_1880.reader.capTable;
  value_32.reader.segment = local_1880.reader.segment;
  value_32.reader.ptr = local_1880.reader.ptr;
  value_32.reader.elementCount = local_1880.reader.elementCount;
  value_32.reader.step = local_1880.reader.step;
  value_32.reader.structDataSize = local_1880.reader.structDataSize;
  value_32.reader.structPointerCount = local_1880.reader.structPointerCount;
  value_32.reader.elementSize = local_1880.reader.elementSize;
  value_32.reader._39_1_ = local_1880.reader._39_1_;
  value_32.reader.nestingLimit = local_1880.reader.nestingLimit;
  value_32.reader._44_4_ = local_1880.reader._44_4_;
  capnproto_test::capnp::test::TestAllTypes::Builder::setUInt16List((Builder *)local_17c0,value_32);
  List<unsigned_int,_(capnp::Kind)0>::Reader::Reader(&local_18b0);
  value_33.reader.capTable = local_18b0.reader.capTable;
  value_33.reader.segment = local_18b0.reader.segment;
  value_33.reader.ptr = local_18b0.reader.ptr;
  value_33.reader.elementCount = local_18b0.reader.elementCount;
  value_33.reader.step = local_18b0.reader.step;
  value_33.reader.structDataSize = local_18b0.reader.structDataSize;
  value_33.reader.structPointerCount = local_18b0.reader.structPointerCount;
  value_33.reader.elementSize = local_18b0.reader.elementSize;
  value_33.reader._39_1_ = local_18b0.reader._39_1_;
  value_33.reader.nestingLimit = local_18b0.reader.nestingLimit;
  value_33.reader._44_4_ = local_18b0.reader._44_4_;
  capnproto_test::capnp::test::TestAllTypes::Builder::setUInt32List((Builder *)local_17c0,value_33);
  List<unsigned_long,_(capnp::Kind)0>::Reader::Reader(&local_18e0);
  value_34.reader.capTable = local_18e0.reader.capTable;
  value_34.reader.segment = local_18e0.reader.segment;
  value_34.reader.ptr = local_18e0.reader.ptr;
  value_34.reader.elementCount = local_18e0.reader.elementCount;
  value_34.reader.step = local_18e0.reader.step;
  value_34.reader.structDataSize = local_18e0.reader.structDataSize;
  value_34.reader.structPointerCount = local_18e0.reader.structPointerCount;
  value_34.reader.elementSize = local_18e0.reader.elementSize;
  value_34.reader._39_1_ = local_18e0.reader._39_1_;
  value_34.reader.nestingLimit = local_18e0.reader.nestingLimit;
  value_34.reader._44_4_ = local_18e0.reader._44_4_;
  capnproto_test::capnp::test::TestAllTypes::Builder::setUInt64List((Builder *)local_17c0,value_34);
  List<signed_char,_(capnp::Kind)0>::Reader::Reader(&local_1910);
  value_35.reader.capTable = local_1910.reader.capTable;
  value_35.reader.segment = local_1910.reader.segment;
  value_35.reader.ptr = local_1910.reader.ptr;
  value_35.reader.elementCount = local_1910.reader.elementCount;
  value_35.reader.step = local_1910.reader.step;
  value_35.reader.structDataSize = local_1910.reader.structDataSize;
  value_35.reader.structPointerCount = local_1910.reader.structPointerCount;
  value_35.reader.elementSize = local_1910.reader.elementSize;
  value_35.reader._39_1_ = local_1910.reader._39_1_;
  value_35.reader.nestingLimit = local_1910.reader.nestingLimit;
  value_35.reader._44_4_ = local_1910.reader._44_4_;
  capnproto_test::capnp::test::TestAllTypes::Builder::setInt8List((Builder *)local_17c0,value_35);
  List<short,_(capnp::Kind)0>::Reader::Reader(&local_1940);
  value_36.reader.capTable = local_1940.reader.capTable;
  value_36.reader.segment = local_1940.reader.segment;
  value_36.reader.ptr = local_1940.reader.ptr;
  value_36.reader.elementCount = local_1940.reader.elementCount;
  value_36.reader.step = local_1940.reader.step;
  value_36.reader.structDataSize = local_1940.reader.structDataSize;
  value_36.reader.structPointerCount = local_1940.reader.structPointerCount;
  value_36.reader.elementSize = local_1940.reader.elementSize;
  value_36.reader._39_1_ = local_1940.reader._39_1_;
  value_36.reader.nestingLimit = local_1940.reader.nestingLimit;
  value_36.reader._44_4_ = local_1940.reader._44_4_;
  capnproto_test::capnp::test::TestAllTypes::Builder::setInt16List((Builder *)local_17c0,value_36);
  List<int,_(capnp::Kind)0>::Reader::Reader(&local_1970);
  value_37.reader.capTable = local_1970.reader.capTable;
  value_37.reader.segment = local_1970.reader.segment;
  value_37.reader.ptr = local_1970.reader.ptr;
  value_37.reader.elementCount = local_1970.reader.elementCount;
  value_37.reader.step = local_1970.reader.step;
  value_37.reader.structDataSize = local_1970.reader.structDataSize;
  value_37.reader.structPointerCount = local_1970.reader.structPointerCount;
  value_37.reader.elementSize = local_1970.reader.elementSize;
  value_37.reader._39_1_ = local_1970.reader._39_1_;
  value_37.reader.nestingLimit = local_1970.reader.nestingLimit;
  value_37.reader._44_4_ = local_1970.reader._44_4_;
  capnproto_test::capnp::test::TestAllTypes::Builder::setInt32List((Builder *)local_17c0,value_37);
  List<long,_(capnp::Kind)0>::Reader::Reader(&local_19a0);
  value_38.reader.capTable = local_19a0.reader.capTable;
  value_38.reader.segment = local_19a0.reader.segment;
  value_38.reader.ptr = local_19a0.reader.ptr;
  value_38.reader.elementCount = local_19a0.reader.elementCount;
  value_38.reader.step = local_19a0.reader.step;
  value_38.reader.structDataSize = local_19a0.reader.structDataSize;
  value_38.reader.structPointerCount = local_19a0.reader.structPointerCount;
  value_38.reader.elementSize = local_19a0.reader.elementSize;
  value_38.reader._39_1_ = local_19a0.reader._39_1_;
  value_38.reader.nestingLimit = local_19a0.reader.nestingLimit;
  value_38.reader._44_4_ = local_19a0.reader._44_4_;
  capnproto_test::capnp::test::TestAllTypes::Builder::setInt64List((Builder *)local_17c0,value_38);
  List<float,_(capnp::Kind)0>::Reader::Reader(&local_19d0);
  value_39.reader.capTable = local_19d0.reader.capTable;
  value_39.reader.segment = local_19d0.reader.segment;
  value_39.reader.ptr = local_19d0.reader.ptr;
  value_39.reader.elementCount = local_19d0.reader.elementCount;
  value_39.reader.step = local_19d0.reader.step;
  value_39.reader.structDataSize = local_19d0.reader.structDataSize;
  value_39.reader.structPointerCount = local_19d0.reader.structPointerCount;
  value_39.reader.elementSize = local_19d0.reader.elementSize;
  value_39.reader._39_1_ = local_19d0.reader._39_1_;
  value_39.reader.nestingLimit = local_19d0.reader.nestingLimit;
  value_39.reader._44_4_ = local_19d0.reader._44_4_;
  capnproto_test::capnp::test::TestAllTypes::Builder::setFloat32List((Builder *)local_17c0,value_39)
  ;
  List<double,_(capnp::Kind)0>::Reader::Reader(&local_1a00);
  value_40.reader.capTable = local_1a00.reader.capTable;
  value_40.reader.segment = local_1a00.reader.segment;
  value_40.reader.ptr = local_1a00.reader.ptr;
  value_40.reader.elementCount = local_1a00.reader.elementCount;
  value_40.reader.step = local_1a00.reader.step;
  value_40.reader.structDataSize = local_1a00.reader.structDataSize;
  value_40.reader.structPointerCount = local_1a00.reader.structPointerCount;
  value_40.reader.elementSize = local_1a00.reader.elementSize;
  value_40.reader._39_1_ = local_1a00.reader._39_1_;
  value_40.reader.nestingLimit = local_1a00.reader.nestingLimit;
  value_40.reader._44_4_ = local_1a00.reader._44_4_;
  capnproto_test::capnp::test::TestAllTypes::Builder::setFloat64List((Builder *)local_17c0,value_40)
  ;
  List<capnp::Text,_(capnp::Kind)1>::Reader::Reader(&local_1a30);
  value_41.reader.capTable = local_1a30.reader.capTable;
  value_41.reader.segment = local_1a30.reader.segment;
  value_41.reader.ptr = local_1a30.reader.ptr;
  value_41.reader.elementCount = local_1a30.reader.elementCount;
  value_41.reader.step = local_1a30.reader.step;
  value_41.reader.structDataSize = local_1a30.reader.structDataSize;
  value_41.reader.structPointerCount = local_1a30.reader.structPointerCount;
  value_41.reader.elementSize = local_1a30.reader.elementSize;
  value_41.reader._39_1_ = local_1a30.reader._39_1_;
  value_41.reader.nestingLimit = local_1a30.reader.nestingLimit;
  value_41.reader._44_4_ = local_1a30.reader._44_4_;
  capnproto_test::capnp::test::TestAllTypes::Builder::setTextList((Builder *)local_17c0,value_41);
  List<capnp::Data,_(capnp::Kind)1>::Reader::Reader(&local_1a60);
  value_42.reader.capTable = local_1a60.reader.capTable;
  value_42.reader.segment = local_1a60.reader.segment;
  value_42.reader.ptr = local_1a60.reader.ptr;
  value_42.reader.elementCount = local_1a60.reader.elementCount;
  value_42.reader.step = local_1a60.reader.step;
  value_42.reader.structDataSize = local_1a60.reader.structDataSize;
  value_42.reader.structPointerCount = local_1a60.reader.structPointerCount;
  value_42.reader.elementSize = local_1a60.reader.elementSize;
  value_42.reader._39_1_ = local_1a60.reader._39_1_;
  value_42.reader.nestingLimit = local_1a60.reader.nestingLimit;
  value_42.reader._44_4_ = local_1a60.reader._44_4_;
  capnproto_test::capnp::test::TestAllTypes::Builder::setDataList((Builder *)local_17c0,value_42);
  List<capnproto_test::capnp::test::TestAllTypes,_(capnp::Kind)3>::Reader::Reader
            ((Reader *)auStack_1a90);
  value_43.reader.capTable = pCStack_1a88;
  value_43.reader.segment = _auStack_1a90;
  value_43.reader.ptr = local_1a80;
  value_43.reader.elementCount = LStack_1a78;
  value_43.reader.step = BStack_1a74;
  value_43.reader.structDataSize = local_1a70;
  value_43.reader.structPointerCount = SStack_1a6c;
  value_43.reader.elementSize = EStack_1a6a;
  value_43.reader._39_1_ = uStack_1a69;
  value_43.reader.nestingLimit = iStack_1a68;
  value_43.reader._44_4_ = uStack_1a64;
  capnproto_test::capnp::test::TestAllTypes::Builder::setStructList((Builder *)local_17c0,value_43);
  bVar2 = capnproto_test::capnp::test::TestAllTypes::Builder::hasVoidList((Builder *)local_17c0);
  if (!bVar2) {
    local_1a91 = kj::_::Debug::shouldLog(ERROR);
    while (local_1a91 != false) {
      kj::_::Debug::log<char_const(&)[36]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
                 ,0x241,ERROR,"\"failed: expected \" \"root.hasVoidList()\"",
                 (char (*) [36])"failed: expected root.hasVoidList()");
      local_1a91 = false;
    }
  }
  capnproto_test::capnp::test::TestAllTypes::Builder::getVoidList
            ((Builder *)local_1ac0,(Builder *)local_17c0);
  uVar3 = List<capnp::Void,_(capnp::Kind)0>::Builder::size((Builder *)local_1ac0);
  if (uVar3 != 0) {
    local_1ac1 = kj::_::Debug::shouldLog(ERROR);
    while (local_1ac1 != false) {
      local_1acc[1] = 0;
      capnproto_test::capnp::test::TestAllTypes::Builder::getVoidList
                ((Builder *)local_1af8,(Builder *)local_17c0);
      local_1acc[0] = List<capnp::Void,_(capnp::Kind)0>::Builder::size((Builder *)local_1af8);
      kj::_::Debug::log<char_const(&)[52],int,unsigned_int>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
                 ,0x241,ERROR,
                 "\"failed: expected \" \"(0) == (root.getVoidList().size())\", 0, root.getVoidList().size()"
                 ,(char (*) [52])"failed: expected (0) == (root.getVoidList().size())",
                 (int *)(local_1acc + 1),local_1acc);
      local_1ac1 = false;
    }
  }
  bVar2 = capnproto_test::capnp::test::TestAllTypes::Builder::hasBoolList((Builder *)local_17c0);
  if (!bVar2) {
    local_1af9 = kj::_::Debug::shouldLog(ERROR);
    while (local_1af9 != false) {
      kj::_::Debug::log<char_const(&)[36]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
                 ,0x241,ERROR,"\"failed: expected \" \"root.hasBoolList()\"",
                 (char (*) [36])"failed: expected root.hasBoolList()");
      local_1af9 = false;
    }
  }
  capnproto_test::capnp::test::TestAllTypes::Builder::getBoolList
            ((Builder *)local_1b28,(Builder *)local_17c0);
  uVar3 = List<bool,_(capnp::Kind)0>::Builder::size((Builder *)local_1b28);
  if (uVar3 != 0) {
    local_1b29 = kj::_::Debug::shouldLog(ERROR);
    while (local_1b29 != false) {
      local_1b34[1] = 0;
      capnproto_test::capnp::test::TestAllTypes::Builder::getBoolList
                ((Builder *)local_1b60,(Builder *)local_17c0);
      local_1b34[0] = List<bool,_(capnp::Kind)0>::Builder::size((Builder *)local_1b60);
      kj::_::Debug::log<char_const(&)[52],int,unsigned_int>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
                 ,0x241,ERROR,
                 "\"failed: expected \" \"(0) == (root.getBoolList().size())\", 0, root.getBoolList().size()"
                 ,(char (*) [52])"failed: expected (0) == (root.getBoolList().size())",
                 (int *)(local_1b34 + 1),local_1b34);
      local_1b29 = false;
    }
  }
  bVar2 = capnproto_test::capnp::test::TestAllTypes::Builder::hasUInt8List((Builder *)local_17c0);
  if (!bVar2) {
    local_1b61 = kj::_::Debug::shouldLog(ERROR);
    while (local_1b61 != false) {
      kj::_::Debug::log<char_const(&)[37]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
                 ,0x241,ERROR,"\"failed: expected \" \"root.hasUInt8List()\"",
                 (char (*) [37])"failed: expected root.hasUInt8List()");
      local_1b61 = false;
    }
  }
  capnproto_test::capnp::test::TestAllTypes::Builder::getUInt8List
            ((Builder *)local_1b90,(Builder *)local_17c0);
  uVar3 = List<unsigned_char,_(capnp::Kind)0>::Builder::size((Builder *)local_1b90);
  if (uVar3 != 0) {
    local_1b91 = kj::_::Debug::shouldLog(ERROR);
    while (local_1b91 != false) {
      local_1b9c[1] = 0;
      capnproto_test::capnp::test::TestAllTypes::Builder::getUInt8List
                ((Builder *)local_1bc8,(Builder *)local_17c0);
      local_1b9c[0] = List<unsigned_char,_(capnp::Kind)0>::Builder::size((Builder *)local_1bc8);
      kj::_::Debug::log<char_const(&)[53],int,unsigned_int>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
                 ,0x241,ERROR,
                 "\"failed: expected \" \"(0) == (root.getUInt8List().size())\", 0, root.getUInt8List().size()"
                 ,(char (*) [53])"failed: expected (0) == (root.getUInt8List().size())",
                 (int *)(local_1b9c + 1),local_1b9c);
      local_1b91 = false;
    }
  }
  bVar2 = capnproto_test::capnp::test::TestAllTypes::Builder::hasUInt16List((Builder *)local_17c0);
  if (!bVar2) {
    local_1bc9 = kj::_::Debug::shouldLog(ERROR);
    while (local_1bc9 != false) {
      kj::_::Debug::log<char_const(&)[38]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
                 ,0x241,ERROR,"\"failed: expected \" \"root.hasUInt16List()\"",
                 (char (*) [38])"failed: expected root.hasUInt16List()");
      local_1bc9 = false;
    }
  }
  capnproto_test::capnp::test::TestAllTypes::Builder::getUInt16List
            ((Builder *)local_1bf8,(Builder *)local_17c0);
  uVar3 = List<unsigned_short,_(capnp::Kind)0>::Builder::size((Builder *)local_1bf8);
  if (uVar3 != 0) {
    local_1bf9 = kj::_::Debug::shouldLog(ERROR);
    while (local_1bf9 != false) {
      local_1c04[1] = 0;
      capnproto_test::capnp::test::TestAllTypes::Builder::getUInt16List
                ((Builder *)local_1c30,(Builder *)local_17c0);
      local_1c04[0] = List<unsigned_short,_(capnp::Kind)0>::Builder::size((Builder *)local_1c30);
      kj::_::Debug::log<char_const(&)[54],int,unsigned_int>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
                 ,0x241,ERROR,
                 "\"failed: expected \" \"(0) == (root.getUInt16List().size())\", 0, root.getUInt16List().size()"
                 ,(char (*) [54])"failed: expected (0) == (root.getUInt16List().size())",
                 (int *)(local_1c04 + 1),local_1c04);
      local_1bf9 = false;
    }
  }
  bVar2 = capnproto_test::capnp::test::TestAllTypes::Builder::hasUInt32List((Builder *)local_17c0);
  if (!bVar2) {
    local_1c31 = kj::_::Debug::shouldLog(ERROR);
    while (local_1c31 != false) {
      kj::_::Debug::log<char_const(&)[38]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
                 ,0x241,ERROR,"\"failed: expected \" \"root.hasUInt32List()\"",
                 (char (*) [38])"failed: expected root.hasUInt32List()");
      local_1c31 = false;
    }
  }
  capnproto_test::capnp::test::TestAllTypes::Builder::getUInt32List
            ((Builder *)local_1c60,(Builder *)local_17c0);
  uVar3 = List<unsigned_int,_(capnp::Kind)0>::Builder::size((Builder *)local_1c60);
  if (uVar3 != 0) {
    local_1c61 = kj::_::Debug::shouldLog(ERROR);
    while (local_1c61 != false) {
      local_1c6c[1] = 0;
      capnproto_test::capnp::test::TestAllTypes::Builder::getUInt32List
                ((Builder *)local_1c98,(Builder *)local_17c0);
      local_1c6c[0] = List<unsigned_int,_(capnp::Kind)0>::Builder::size((Builder *)local_1c98);
      kj::_::Debug::log<char_const(&)[54],int,unsigned_int>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
                 ,0x241,ERROR,
                 "\"failed: expected \" \"(0) == (root.getUInt32List().size())\", 0, root.getUInt32List().size()"
                 ,(char (*) [54])"failed: expected (0) == (root.getUInt32List().size())",
                 (int *)(local_1c6c + 1),local_1c6c);
      local_1c61 = false;
    }
  }
  bVar2 = capnproto_test::capnp::test::TestAllTypes::Builder::hasUInt64List((Builder *)local_17c0);
  if (!bVar2) {
    local_1c99 = kj::_::Debug::shouldLog(ERROR);
    while (local_1c99 != false) {
      kj::_::Debug::log<char_const(&)[38]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
                 ,0x241,ERROR,"\"failed: expected \" \"root.hasUInt64List()\"",
                 (char (*) [38])"failed: expected root.hasUInt64List()");
      local_1c99 = false;
    }
  }
  capnproto_test::capnp::test::TestAllTypes::Builder::getUInt64List
            ((Builder *)local_1cc8,(Builder *)local_17c0);
  uVar3 = List<unsigned_long,_(capnp::Kind)0>::Builder::size((Builder *)local_1cc8);
  if (uVar3 != 0) {
    local_1cc9 = kj::_::Debug::shouldLog(ERROR);
    while (local_1cc9 != false) {
      local_1cd4[1] = 0;
      capnproto_test::capnp::test::TestAllTypes::Builder::getUInt64List
                ((Builder *)local_1d00,(Builder *)local_17c0);
      local_1cd4[0] = List<unsigned_long,_(capnp::Kind)0>::Builder::size((Builder *)local_1d00);
      kj::_::Debug::log<char_const(&)[54],int,unsigned_int>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
                 ,0x241,ERROR,
                 "\"failed: expected \" \"(0) == (root.getUInt64List().size())\", 0, root.getUInt64List().size()"
                 ,(char (*) [54])"failed: expected (0) == (root.getUInt64List().size())",
                 (int *)(local_1cd4 + 1),local_1cd4);
      local_1cc9 = false;
    }
  }
  bVar2 = capnproto_test::capnp::test::TestAllTypes::Builder::hasInt8List((Builder *)local_17c0);
  if (!bVar2) {
    local_1d01 = kj::_::Debug::shouldLog(ERROR);
    while (local_1d01 != false) {
      kj::_::Debug::log<char_const(&)[36]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
                 ,0x241,ERROR,"\"failed: expected \" \"root.hasInt8List()\"",
                 (char (*) [36])"failed: expected root.hasInt8List()");
      local_1d01 = false;
    }
  }
  capnproto_test::capnp::test::TestAllTypes::Builder::getInt8List
            ((Builder *)local_1d30,(Builder *)local_17c0);
  uVar3 = List<signed_char,_(capnp::Kind)0>::Builder::size((Builder *)local_1d30);
  if (uVar3 != 0) {
    local_1d31 = kj::_::Debug::shouldLog(ERROR);
    while (local_1d31 != false) {
      local_1d3c[1] = 0;
      capnproto_test::capnp::test::TestAllTypes::Builder::getInt8List
                ((Builder *)local_1d68,(Builder *)local_17c0);
      local_1d3c[0] = List<signed_char,_(capnp::Kind)0>::Builder::size((Builder *)local_1d68);
      kj::_::Debug::log<char_const(&)[52],int,unsigned_int>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
                 ,0x241,ERROR,
                 "\"failed: expected \" \"(0) == (root.getInt8List().size())\", 0, root.getInt8List().size()"
                 ,(char (*) [52])"failed: expected (0) == (root.getInt8List().size())",
                 (int *)(local_1d3c + 1),local_1d3c);
      local_1d31 = false;
    }
  }
  bVar2 = capnproto_test::capnp::test::TestAllTypes::Builder::hasInt16List((Builder *)local_17c0);
  if (!bVar2) {
    local_1d69 = kj::_::Debug::shouldLog(ERROR);
    while (local_1d69 != false) {
      kj::_::Debug::log<char_const(&)[37]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
                 ,0x241,ERROR,"\"failed: expected \" \"root.hasInt16List()\"",
                 (char (*) [37])"failed: expected root.hasInt16List()");
      local_1d69 = false;
    }
  }
  capnproto_test::capnp::test::TestAllTypes::Builder::getInt16List
            ((Builder *)local_1d98,(Builder *)local_17c0);
  uVar3 = List<short,_(capnp::Kind)0>::Builder::size((Builder *)local_1d98);
  if (uVar3 != 0) {
    local_1d99 = kj::_::Debug::shouldLog(ERROR);
    while (local_1d99 != false) {
      local_1da4[1] = 0;
      capnproto_test::capnp::test::TestAllTypes::Builder::getInt16List
                ((Builder *)local_1dd0,(Builder *)local_17c0);
      local_1da4[0] = List<short,_(capnp::Kind)0>::Builder::size((Builder *)local_1dd0);
      kj::_::Debug::log<char_const(&)[53],int,unsigned_int>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
                 ,0x241,ERROR,
                 "\"failed: expected \" \"(0) == (root.getInt16List().size())\", 0, root.getInt16List().size()"
                 ,(char (*) [53])"failed: expected (0) == (root.getInt16List().size())",
                 (int *)(local_1da4 + 1),local_1da4);
      local_1d99 = false;
    }
  }
  bVar2 = capnproto_test::capnp::test::TestAllTypes::Builder::hasInt32List((Builder *)local_17c0);
  if (!bVar2) {
    local_1dd1 = kj::_::Debug::shouldLog(ERROR);
    while (local_1dd1 != false) {
      kj::_::Debug::log<char_const(&)[37]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
                 ,0x241,ERROR,"\"failed: expected \" \"root.hasInt32List()\"",
                 (char (*) [37])"failed: expected root.hasInt32List()");
      local_1dd1 = false;
    }
  }
  capnproto_test::capnp::test::TestAllTypes::Builder::getInt32List
            ((Builder *)local_1e00,(Builder *)local_17c0);
  uVar3 = List<int,_(capnp::Kind)0>::Builder::size((Builder *)local_1e00);
  if (uVar3 != 0) {
    local_1e01 = kj::_::Debug::shouldLog(ERROR);
    while (local_1e01 != false) {
      local_1e0c[1] = 0;
      capnproto_test::capnp::test::TestAllTypes::Builder::getInt32List
                ((Builder *)local_1e38,(Builder *)local_17c0);
      local_1e0c[0] = List<int,_(capnp::Kind)0>::Builder::size((Builder *)local_1e38);
      kj::_::Debug::log<char_const(&)[53],int,unsigned_int>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
                 ,0x241,ERROR,
                 "\"failed: expected \" \"(0) == (root.getInt32List().size())\", 0, root.getInt32List().size()"
                 ,(char (*) [53])"failed: expected (0) == (root.getInt32List().size())",
                 (int *)(local_1e0c + 1),local_1e0c);
      local_1e01 = false;
    }
  }
  bVar2 = capnproto_test::capnp::test::TestAllTypes::Builder::hasInt64List((Builder *)local_17c0);
  if (!bVar2) {
    local_1e39 = kj::_::Debug::shouldLog(ERROR);
    while (local_1e39 != false) {
      kj::_::Debug::log<char_const(&)[37]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
                 ,0x241,ERROR,"\"failed: expected \" \"root.hasInt64List()\"",
                 (char (*) [37])"failed: expected root.hasInt64List()");
      local_1e39 = false;
    }
  }
  capnproto_test::capnp::test::TestAllTypes::Builder::getInt64List
            ((Builder *)local_1e68,(Builder *)local_17c0);
  uVar3 = List<long,_(capnp::Kind)0>::Builder::size((Builder *)local_1e68);
  if (uVar3 != 0) {
    local_1e69 = kj::_::Debug::shouldLog(ERROR);
    while (local_1e69 != false) {
      local_1e74[1] = 0;
      capnproto_test::capnp::test::TestAllTypes::Builder::getInt64List
                ((Builder *)local_1ea0,(Builder *)local_17c0);
      local_1e74[0] = List<long,_(capnp::Kind)0>::Builder::size((Builder *)local_1ea0);
      kj::_::Debug::log<char_const(&)[53],int,unsigned_int>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
                 ,0x241,ERROR,
                 "\"failed: expected \" \"(0) == (root.getInt64List().size())\", 0, root.getInt64List().size()"
                 ,(char (*) [53])"failed: expected (0) == (root.getInt64List().size())",
                 (int *)(local_1e74 + 1),local_1e74);
      local_1e69 = false;
    }
  }
  bVar2 = capnproto_test::capnp::test::TestAllTypes::Builder::hasFloat32List((Builder *)local_17c0);
  if (!bVar2) {
    local_1ea1 = kj::_::Debug::shouldLog(ERROR);
    while (local_1ea1 != false) {
      kj::_::Debug::log<char_const(&)[39]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
                 ,0x241,ERROR,"\"failed: expected \" \"root.hasFloat32List()\"",
                 (char (*) [39])"failed: expected root.hasFloat32List()");
      local_1ea1 = false;
    }
  }
  capnproto_test::capnp::test::TestAllTypes::Builder::getFloat32List
            ((Builder *)local_1ed0,(Builder *)local_17c0);
  uVar3 = List<float,_(capnp::Kind)0>::Builder::size((Builder *)local_1ed0);
  if (uVar3 != 0) {
    local_1ed1 = kj::_::Debug::shouldLog(ERROR);
    while (local_1ed1 != false) {
      local_1edc[1] = 0;
      capnproto_test::capnp::test::TestAllTypes::Builder::getFloat32List
                ((Builder *)local_1f08,(Builder *)local_17c0);
      local_1edc[0] = List<float,_(capnp::Kind)0>::Builder::size((Builder *)local_1f08);
      kj::_::Debug::log<char_const(&)[55],int,unsigned_int>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
                 ,0x241,ERROR,
                 "\"failed: expected \" \"(0) == (root.getFloat32List().size())\", 0, root.getFloat32List().size()"
                 ,(char (*) [55])"failed: expected (0) == (root.getFloat32List().size())",
                 (int *)(local_1edc + 1),local_1edc);
      local_1ed1 = false;
    }
  }
  bVar2 = capnproto_test::capnp::test::TestAllTypes::Builder::hasFloat64List((Builder *)local_17c0);
  if (!bVar2) {
    local_1f09 = kj::_::Debug::shouldLog(ERROR);
    while (local_1f09 != false) {
      kj::_::Debug::log<char_const(&)[39]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
                 ,0x241,ERROR,"\"failed: expected \" \"root.hasFloat64List()\"",
                 (char (*) [39])"failed: expected root.hasFloat64List()");
      local_1f09 = false;
    }
  }
  capnproto_test::capnp::test::TestAllTypes::Builder::getFloat64List
            ((Builder *)local_1f38,(Builder *)local_17c0);
  uVar3 = List<double,_(capnp::Kind)0>::Builder::size((Builder *)local_1f38);
  if (uVar3 != 0) {
    local_1f39 = kj::_::Debug::shouldLog(ERROR);
    while (local_1f39 != false) {
      local_1f44[1] = 0;
      capnproto_test::capnp::test::TestAllTypes::Builder::getFloat64List
                ((Builder *)local_1f70,(Builder *)local_17c0);
      local_1f44[0] = List<double,_(capnp::Kind)0>::Builder::size((Builder *)local_1f70);
      kj::_::Debug::log<char_const(&)[55],int,unsigned_int>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
                 ,0x241,ERROR,
                 "\"failed: expected \" \"(0) == (root.getFloat64List().size())\", 0, root.getFloat64List().size()"
                 ,(char (*) [55])"failed: expected (0) == (root.getFloat64List().size())",
                 (int *)(local_1f44 + 1),local_1f44);
      local_1f39 = false;
    }
  }
  bVar2 = capnproto_test::capnp::test::TestAllTypes::Builder::hasTextList((Builder *)local_17c0);
  if (!bVar2) {
    local_1f71 = kj::_::Debug::shouldLog(ERROR);
    while (local_1f71 != false) {
      kj::_::Debug::log<char_const(&)[36]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
                 ,0x241,ERROR,"\"failed: expected \" \"root.hasTextList()\"",
                 (char (*) [36])"failed: expected root.hasTextList()");
      local_1f71 = false;
    }
  }
  capnproto_test::capnp::test::TestAllTypes::Builder::getTextList
            ((Builder *)local_1fa0,(Builder *)local_17c0);
  uVar3 = List<capnp::Text,_(capnp::Kind)1>::Builder::size((Builder *)local_1fa0);
  if (uVar3 != 0) {
    local_1fa1 = kj::_::Debug::shouldLog(ERROR);
    while (local_1fa1 != false) {
      local_1fac[1] = 0;
      capnproto_test::capnp::test::TestAllTypes::Builder::getTextList
                ((Builder *)local_1fd8,(Builder *)local_17c0);
      local_1fac[0] = List<capnp::Text,_(capnp::Kind)1>::Builder::size((Builder *)local_1fd8);
      kj::_::Debug::log<char_const(&)[52],int,unsigned_int>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
                 ,0x241,ERROR,
                 "\"failed: expected \" \"(0) == (root.getTextList().size())\", 0, root.getTextList().size()"
                 ,(char (*) [52])"failed: expected (0) == (root.getTextList().size())",
                 (int *)(local_1fac + 1),local_1fac);
      local_1fa1 = false;
    }
  }
  bVar2 = capnproto_test::capnp::test::TestAllTypes::Builder::hasDataList((Builder *)local_17c0);
  if (!bVar2) {
    local_1fd9 = kj::_::Debug::shouldLog(ERROR);
    while (local_1fd9 != false) {
      kj::_::Debug::log<char_const(&)[36]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
                 ,0x241,ERROR,"\"failed: expected \" \"root.hasDataList()\"",
                 (char (*) [36])"failed: expected root.hasDataList()");
      local_1fd9 = false;
    }
  }
  capnproto_test::capnp::test::TestAllTypes::Builder::getDataList
            ((Builder *)local_2008,(Builder *)local_17c0);
  uVar3 = List<capnp::Data,_(capnp::Kind)1>::Builder::size((Builder *)local_2008);
  if (uVar3 != 0) {
    local_2009 = kj::_::Debug::shouldLog(ERROR);
    while (local_2009 != false) {
      local_2014[1] = 0;
      capnproto_test::capnp::test::TestAllTypes::Builder::getDataList
                ((Builder *)local_2040,(Builder *)local_17c0);
      local_2014[0] = List<capnp::Data,_(capnp::Kind)1>::Builder::size((Builder *)local_2040);
      kj::_::Debug::log<char_const(&)[52],int,unsigned_int>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
                 ,0x241,ERROR,
                 "\"failed: expected \" \"(0) == (root.getDataList().size())\", 0, root.getDataList().size()"
                 ,(char (*) [52])"failed: expected (0) == (root.getDataList().size())",
                 (int *)(local_2014 + 1),local_2014);
      local_2009 = false;
    }
  }
  bVar2 = capnproto_test::capnp::test::TestAllTypes::Builder::hasStructList((Builder *)local_17c0);
  if (!bVar2) {
    local_2041 = kj::_::Debug::shouldLog(ERROR);
    while (local_2041 != false) {
      kj::_::Debug::log<char_const(&)[38]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
                 ,0x241,ERROR,"\"failed: expected \" \"root.hasStructList()\"",
                 (char (*) [38])"failed: expected root.hasStructList()");
      local_2041 = false;
    }
  }
  capnproto_test::capnp::test::TestAllTypes::Builder::getStructList
            ((Builder *)local_2070,(Builder *)local_17c0);
  uVar3 = List<capnproto_test::capnp::test::TestAllTypes,_(capnp::Kind)3>::Builder::size
                    ((Builder *)local_2070);
  if (uVar3 != 0) {
    local_2071 = kj::_::Debug::shouldLog(ERROR);
    while (local_2071 != false) {
      local_207c[1] = 0;
      capnproto_test::capnp::test::TestAllTypes::Builder::getStructList
                ((Builder *)&builder_3.moreSegments.builder.disposer,(Builder *)local_17c0);
      local_207c[0] =
           List<capnproto_test::capnp::test::TestAllTypes,_(capnp::Kind)3>::Builder::size
                     ((Builder *)&builder_3.moreSegments.builder.disposer);
      kj::_::Debug::log<char_const(&)[54],int,unsigned_int>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
                 ,0x241,ERROR,
                 "\"failed: expected \" \"(0) == (root.getStructList().size())\", 0, root.getStructList().size()"
                 ,(char (*) [54])"failed: expected (0) == (root.getStructList().size())",
                 (int *)(local_207c + 1),local_207c);
      local_2071 = false;
    }
  }
  MallocMessageBuilder::~MallocMessageBuilder((MallocMessageBuilder *)&root_2._builder.dataSize);
  pSVar1 = &root_3._builder.dataSize;
  MallocMessageBuilder::MallocMessageBuilder
            ((MallocMessageBuilder *)pSVar1,0x400,GROW_HEURISTICALLY);
  MessageBuilder::initRoot<capnproto_test::capnp::test::TestAllTypes>
            ((Builder *)local_21c0,(MessageBuilder *)pSVar1);
  List<capnp::Void,_(capnp::Kind)0>::Builder::Builder(&local_2218);
  List::Builder::operator_cast_to_Reader(&local_21f0,(Builder *)&local_2218);
  value_44.reader.capTable = local_21f0.reader.capTable;
  value_44.reader.segment = local_21f0.reader.segment;
  value_44.reader.ptr = local_21f0.reader.ptr;
  value_44.reader.elementCount = local_21f0.reader.elementCount;
  value_44.reader.step = local_21f0.reader.step;
  value_44.reader.structDataSize = local_21f0.reader.structDataSize;
  value_44.reader.structPointerCount = local_21f0.reader.structPointerCount;
  value_44.reader.elementSize = local_21f0.reader.elementSize;
  value_44.reader._39_1_ = local_21f0.reader._39_1_;
  value_44.reader.nestingLimit = local_21f0.reader.nestingLimit;
  value_44.reader._44_4_ = local_21f0.reader._44_4_;
  capnproto_test::capnp::test::TestAllTypes::Builder::setVoidList((Builder *)local_21c0,value_44);
  List<bool,_(capnp::Kind)0>::Builder::Builder(&local_2270);
  List::Builder::operator_cast_to_Reader(&local_2248,(Builder *)&local_2270);
  value_45.reader.capTable = local_2248.reader.capTable;
  value_45.reader.segment = local_2248.reader.segment;
  value_45.reader.ptr = local_2248.reader.ptr;
  value_45.reader.elementCount = local_2248.reader.elementCount;
  value_45.reader.step = local_2248.reader.step;
  value_45.reader.structDataSize = local_2248.reader.structDataSize;
  value_45.reader.structPointerCount = local_2248.reader.structPointerCount;
  value_45.reader.elementSize = local_2248.reader.elementSize;
  value_45.reader._39_1_ = local_2248.reader._39_1_;
  value_45.reader.nestingLimit = local_2248.reader.nestingLimit;
  value_45.reader._44_4_ = local_2248.reader._44_4_;
  capnproto_test::capnp::test::TestAllTypes::Builder::setBoolList((Builder *)local_21c0,value_45);
  List<unsigned_char,_(capnp::Kind)0>::Builder::Builder(&local_22c8);
  List::Builder::operator_cast_to_Reader(&local_22a0,(Builder *)&local_22c8);
  value_46.reader.capTable = local_22a0.reader.capTable;
  value_46.reader.segment = local_22a0.reader.segment;
  value_46.reader.ptr = local_22a0.reader.ptr;
  value_46.reader.elementCount = local_22a0.reader.elementCount;
  value_46.reader.step = local_22a0.reader.step;
  value_46.reader.structDataSize = local_22a0.reader.structDataSize;
  value_46.reader.structPointerCount = local_22a0.reader.structPointerCount;
  value_46.reader.elementSize = local_22a0.reader.elementSize;
  value_46.reader._39_1_ = local_22a0.reader._39_1_;
  value_46.reader.nestingLimit = local_22a0.reader.nestingLimit;
  value_46.reader._44_4_ = local_22a0.reader._44_4_;
  capnproto_test::capnp::test::TestAllTypes::Builder::setUInt8List((Builder *)local_21c0,value_46);
  List<unsigned_short,_(capnp::Kind)0>::Builder::Builder(&local_2320);
  List::Builder::operator_cast_to_Reader(&local_22f8,(Builder *)&local_2320);
  value_47.reader.capTable = local_22f8.reader.capTable;
  value_47.reader.segment = local_22f8.reader.segment;
  value_47.reader.ptr = local_22f8.reader.ptr;
  value_47.reader.elementCount = local_22f8.reader.elementCount;
  value_47.reader.step = local_22f8.reader.step;
  value_47.reader.structDataSize = local_22f8.reader.structDataSize;
  value_47.reader.structPointerCount = local_22f8.reader.structPointerCount;
  value_47.reader.elementSize = local_22f8.reader.elementSize;
  value_47.reader._39_1_ = local_22f8.reader._39_1_;
  value_47.reader.nestingLimit = local_22f8.reader.nestingLimit;
  value_47.reader._44_4_ = local_22f8.reader._44_4_;
  capnproto_test::capnp::test::TestAllTypes::Builder::setUInt16List((Builder *)local_21c0,value_47);
  List<unsigned_int,_(capnp::Kind)0>::Builder::Builder(&local_2378);
  List::Builder::operator_cast_to_Reader(&local_2350,(Builder *)&local_2378);
  value_48.reader.capTable = local_2350.reader.capTable;
  value_48.reader.segment = local_2350.reader.segment;
  value_48.reader.ptr = local_2350.reader.ptr;
  value_48.reader.elementCount = local_2350.reader.elementCount;
  value_48.reader.step = local_2350.reader.step;
  value_48.reader.structDataSize = local_2350.reader.structDataSize;
  value_48.reader.structPointerCount = local_2350.reader.structPointerCount;
  value_48.reader.elementSize = local_2350.reader.elementSize;
  value_48.reader._39_1_ = local_2350.reader._39_1_;
  value_48.reader.nestingLimit = local_2350.reader.nestingLimit;
  value_48.reader._44_4_ = local_2350.reader._44_4_;
  capnproto_test::capnp::test::TestAllTypes::Builder::setUInt32List((Builder *)local_21c0,value_48);
  List<unsigned_long,_(capnp::Kind)0>::Builder::Builder(&local_23d0);
  List::Builder::operator_cast_to_Reader(&local_23a8,(Builder *)&local_23d0);
  value_49.reader.capTable = local_23a8.reader.capTable;
  value_49.reader.segment = local_23a8.reader.segment;
  value_49.reader.ptr = local_23a8.reader.ptr;
  value_49.reader.elementCount = local_23a8.reader.elementCount;
  value_49.reader.step = local_23a8.reader.step;
  value_49.reader.structDataSize = local_23a8.reader.structDataSize;
  value_49.reader.structPointerCount = local_23a8.reader.structPointerCount;
  value_49.reader.elementSize = local_23a8.reader.elementSize;
  value_49.reader._39_1_ = local_23a8.reader._39_1_;
  value_49.reader.nestingLimit = local_23a8.reader.nestingLimit;
  value_49.reader._44_4_ = local_23a8.reader._44_4_;
  capnproto_test::capnp::test::TestAllTypes::Builder::setUInt64List((Builder *)local_21c0,value_49);
  List<signed_char,_(capnp::Kind)0>::Builder::Builder(&local_2428);
  List::Builder::operator_cast_to_Reader(&local_2400,(Builder *)&local_2428);
  value_50.reader.capTable = local_2400.reader.capTable;
  value_50.reader.segment = local_2400.reader.segment;
  value_50.reader.ptr = local_2400.reader.ptr;
  value_50.reader.elementCount = local_2400.reader.elementCount;
  value_50.reader.step = local_2400.reader.step;
  value_50.reader.structDataSize = local_2400.reader.structDataSize;
  value_50.reader.structPointerCount = local_2400.reader.structPointerCount;
  value_50.reader.elementSize = local_2400.reader.elementSize;
  value_50.reader._39_1_ = local_2400.reader._39_1_;
  value_50.reader.nestingLimit = local_2400.reader.nestingLimit;
  value_50.reader._44_4_ = local_2400.reader._44_4_;
  capnproto_test::capnp::test::TestAllTypes::Builder::setInt8List((Builder *)local_21c0,value_50);
  List<short,_(capnp::Kind)0>::Builder::Builder(&local_2480);
  List::Builder::operator_cast_to_Reader(&local_2458,(Builder *)&local_2480);
  value_51.reader.capTable = local_2458.reader.capTable;
  value_51.reader.segment = local_2458.reader.segment;
  value_51.reader.ptr = local_2458.reader.ptr;
  value_51.reader.elementCount = local_2458.reader.elementCount;
  value_51.reader.step = local_2458.reader.step;
  value_51.reader.structDataSize = local_2458.reader.structDataSize;
  value_51.reader.structPointerCount = local_2458.reader.structPointerCount;
  value_51.reader.elementSize = local_2458.reader.elementSize;
  value_51.reader._39_1_ = local_2458.reader._39_1_;
  value_51.reader.nestingLimit = local_2458.reader.nestingLimit;
  value_51.reader._44_4_ = local_2458.reader._44_4_;
  capnproto_test::capnp::test::TestAllTypes::Builder::setInt16List((Builder *)local_21c0,value_51);
  List<int,_(capnp::Kind)0>::Builder::Builder(&local_24d8);
  List::Builder::operator_cast_to_Reader(&local_24b0,(Builder *)&local_24d8);
  value_52.reader.capTable = local_24b0.reader.capTable;
  value_52.reader.segment = local_24b0.reader.segment;
  value_52.reader.ptr = local_24b0.reader.ptr;
  value_52.reader.elementCount = local_24b0.reader.elementCount;
  value_52.reader.step = local_24b0.reader.step;
  value_52.reader.structDataSize = local_24b0.reader.structDataSize;
  value_52.reader.structPointerCount = local_24b0.reader.structPointerCount;
  value_52.reader.elementSize = local_24b0.reader.elementSize;
  value_52.reader._39_1_ = local_24b0.reader._39_1_;
  value_52.reader.nestingLimit = local_24b0.reader.nestingLimit;
  value_52.reader._44_4_ = local_24b0.reader._44_4_;
  capnproto_test::capnp::test::TestAllTypes::Builder::setInt32List((Builder *)local_21c0,value_52);
  List<long,_(capnp::Kind)0>::Builder::Builder(&local_2530);
  List::Builder::operator_cast_to_Reader(&local_2508,(Builder *)&local_2530);
  value_53.reader.capTable = local_2508.reader.capTable;
  value_53.reader.segment = local_2508.reader.segment;
  value_53.reader.ptr = local_2508.reader.ptr;
  value_53.reader.elementCount = local_2508.reader.elementCount;
  value_53.reader.step = local_2508.reader.step;
  value_53.reader.structDataSize = local_2508.reader.structDataSize;
  value_53.reader.structPointerCount = local_2508.reader.structPointerCount;
  value_53.reader.elementSize = local_2508.reader.elementSize;
  value_53.reader._39_1_ = local_2508.reader._39_1_;
  value_53.reader.nestingLimit = local_2508.reader.nestingLimit;
  value_53.reader._44_4_ = local_2508.reader._44_4_;
  capnproto_test::capnp::test::TestAllTypes::Builder::setInt64List((Builder *)local_21c0,value_53);
  List<float,_(capnp::Kind)0>::Builder::Builder(&local_2588);
  List::Builder::operator_cast_to_Reader(&local_2560,(Builder *)&local_2588);
  value_54.reader.capTable = local_2560.reader.capTable;
  value_54.reader.segment = local_2560.reader.segment;
  value_54.reader.ptr = local_2560.reader.ptr;
  value_54.reader.elementCount = local_2560.reader.elementCount;
  value_54.reader.step = local_2560.reader.step;
  value_54.reader.structDataSize = local_2560.reader.structDataSize;
  value_54.reader.structPointerCount = local_2560.reader.structPointerCount;
  value_54.reader.elementSize = local_2560.reader.elementSize;
  value_54.reader._39_1_ = local_2560.reader._39_1_;
  value_54.reader.nestingLimit = local_2560.reader.nestingLimit;
  value_54.reader._44_4_ = local_2560.reader._44_4_;
  capnproto_test::capnp::test::TestAllTypes::Builder::setFloat32List((Builder *)local_21c0,value_54)
  ;
  List<double,_(capnp::Kind)0>::Builder::Builder(&local_25e0);
  List::Builder::operator_cast_to_Reader(&local_25b8,(Builder *)&local_25e0);
  value_55.reader.capTable = local_25b8.reader.capTable;
  value_55.reader.segment = local_25b8.reader.segment;
  value_55.reader.ptr = local_25b8.reader.ptr;
  value_55.reader.elementCount = local_25b8.reader.elementCount;
  value_55.reader.step = local_25b8.reader.step;
  value_55.reader.structDataSize = local_25b8.reader.structDataSize;
  value_55.reader.structPointerCount = local_25b8.reader.structPointerCount;
  value_55.reader.elementSize = local_25b8.reader.elementSize;
  value_55.reader._39_1_ = local_25b8.reader._39_1_;
  value_55.reader.nestingLimit = local_25b8.reader.nestingLimit;
  value_55.reader._44_4_ = local_25b8.reader._44_4_;
  capnproto_test::capnp::test::TestAllTypes::Builder::setFloat64List((Builder *)local_21c0,value_55)
  ;
  List<capnp::Text,_(capnp::Kind)1>::Builder::Builder(&local_2638);
  List::Builder::operator_cast_to_Reader(&local_2610,(Builder *)&local_2638);
  value_56.reader.capTable = local_2610.reader.capTable;
  value_56.reader.segment = local_2610.reader.segment;
  value_56.reader.ptr = local_2610.reader.ptr;
  value_56.reader.elementCount = local_2610.reader.elementCount;
  value_56.reader.step = local_2610.reader.step;
  value_56.reader.structDataSize = local_2610.reader.structDataSize;
  value_56.reader.structPointerCount = local_2610.reader.structPointerCount;
  value_56.reader.elementSize = local_2610.reader.elementSize;
  value_56.reader._39_1_ = local_2610.reader._39_1_;
  value_56.reader.nestingLimit = local_2610.reader.nestingLimit;
  value_56.reader._44_4_ = local_2610.reader._44_4_;
  capnproto_test::capnp::test::TestAllTypes::Builder::setTextList((Builder *)local_21c0,value_56);
  List<capnp::Data,_(capnp::Kind)1>::Builder::Builder(&local_2690);
  List::Builder::operator_cast_to_Reader(&local_2668,(Builder *)&local_2690);
  value_57.reader.capTable = local_2668.reader.capTable;
  value_57.reader.segment = local_2668.reader.segment;
  value_57.reader.ptr = local_2668.reader.ptr;
  value_57.reader.elementCount = local_2668.reader.elementCount;
  value_57.reader.step = local_2668.reader.step;
  value_57.reader.structDataSize = local_2668.reader.structDataSize;
  value_57.reader.structPointerCount = local_2668.reader.structPointerCount;
  value_57.reader.elementSize = local_2668.reader.elementSize;
  value_57.reader._39_1_ = local_2668.reader._39_1_;
  value_57.reader.nestingLimit = local_2668.reader.nestingLimit;
  value_57.reader._44_4_ = local_2668.reader._44_4_;
  capnproto_test::capnp::test::TestAllTypes::Builder::setDataList((Builder *)local_21c0,value_57);
  List<capnproto_test::capnp::test::TestAllTypes,_(capnp::Kind)3>::Builder::Builder
            ((Builder *)local_26e8);
  List::Builder::operator_cast_to_Reader(&local_26c0,(Builder *)local_26e8);
  value_58.reader.capTable = local_26c0.reader.capTable;
  value_58.reader.segment = local_26c0.reader.segment;
  value_58.reader.ptr = local_26c0.reader.ptr;
  value_58.reader.elementCount = local_26c0.reader.elementCount;
  value_58.reader.step = local_26c0.reader.step;
  value_58.reader.structDataSize = local_26c0.reader.structDataSize;
  value_58.reader.structPointerCount = local_26c0.reader.structPointerCount;
  value_58.reader.elementSize = local_26c0.reader.elementSize;
  value_58.reader._39_1_ = local_26c0.reader._39_1_;
  value_58.reader.nestingLimit = local_26c0.reader.nestingLimit;
  value_58.reader._44_4_ = local_26c0.reader._44_4_;
  capnproto_test::capnp::test::TestAllTypes::Builder::setStructList((Builder *)local_21c0,value_58);
  bVar2 = capnproto_test::capnp::test::TestAllTypes::Builder::hasVoidList((Builder *)local_21c0);
  if (!bVar2) {
    local_26e9 = kj::_::Debug::shouldLog(ERROR);
    while (local_26e9 != false) {
      kj::_::Debug::log<char_const(&)[36]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
                 ,0x248,ERROR,"\"failed: expected \" \"root.hasVoidList()\"",
                 (char (*) [36])"failed: expected root.hasVoidList()");
      local_26e9 = false;
    }
  }
  capnproto_test::capnp::test::TestAllTypes::Builder::getVoidList
            ((Builder *)local_2718,(Builder *)local_21c0);
  uVar3 = List<capnp::Void,_(capnp::Kind)0>::Builder::size((Builder *)local_2718);
  if (uVar3 != 0) {
    local_2719 = kj::_::Debug::shouldLog(ERROR);
    while (local_2719 != false) {
      local_2724[1] = 0;
      capnproto_test::capnp::test::TestAllTypes::Builder::getVoidList
                ((Builder *)local_2750,(Builder *)local_21c0);
      local_2724[0] = List<capnp::Void,_(capnp::Kind)0>::Builder::size((Builder *)local_2750);
      kj::_::Debug::log<char_const(&)[52],int,unsigned_int>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
                 ,0x248,ERROR,
                 "\"failed: expected \" \"(0) == (root.getVoidList().size())\", 0, root.getVoidList().size()"
                 ,(char (*) [52])"failed: expected (0) == (root.getVoidList().size())",
                 (int *)(local_2724 + 1),local_2724);
      local_2719 = false;
    }
  }
  bVar2 = capnproto_test::capnp::test::TestAllTypes::Builder::hasBoolList((Builder *)local_21c0);
  if (!bVar2) {
    local_2751 = kj::_::Debug::shouldLog(ERROR);
    while (local_2751 != false) {
      kj::_::Debug::log<char_const(&)[36]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
                 ,0x248,ERROR,"\"failed: expected \" \"root.hasBoolList()\"",
                 (char (*) [36])"failed: expected root.hasBoolList()");
      local_2751 = false;
    }
  }
  capnproto_test::capnp::test::TestAllTypes::Builder::getBoolList
            ((Builder *)local_2780,(Builder *)local_21c0);
  uVar3 = List<bool,_(capnp::Kind)0>::Builder::size((Builder *)local_2780);
  if (uVar3 != 0) {
    local_2781 = kj::_::Debug::shouldLog(ERROR);
    while (local_2781 != false) {
      local_278c[1] = 0;
      capnproto_test::capnp::test::TestAllTypes::Builder::getBoolList
                ((Builder *)local_27b8,(Builder *)local_21c0);
      local_278c[0] = List<bool,_(capnp::Kind)0>::Builder::size((Builder *)local_27b8);
      kj::_::Debug::log<char_const(&)[52],int,unsigned_int>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
                 ,0x248,ERROR,
                 "\"failed: expected \" \"(0) == (root.getBoolList().size())\", 0, root.getBoolList().size()"
                 ,(char (*) [52])"failed: expected (0) == (root.getBoolList().size())",
                 (int *)(local_278c + 1),local_278c);
      local_2781 = false;
    }
  }
  bVar2 = capnproto_test::capnp::test::TestAllTypes::Builder::hasUInt8List((Builder *)local_21c0);
  if (!bVar2) {
    local_27b9 = kj::_::Debug::shouldLog(ERROR);
    while (local_27b9 != false) {
      kj::_::Debug::log<char_const(&)[37]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
                 ,0x248,ERROR,"\"failed: expected \" \"root.hasUInt8List()\"",
                 (char (*) [37])"failed: expected root.hasUInt8List()");
      local_27b9 = false;
    }
  }
  capnproto_test::capnp::test::TestAllTypes::Builder::getUInt8List
            ((Builder *)local_27e8,(Builder *)local_21c0);
  uVar3 = List<unsigned_char,_(capnp::Kind)0>::Builder::size((Builder *)local_27e8);
  if (uVar3 != 0) {
    local_27e9 = kj::_::Debug::shouldLog(ERROR);
    while (local_27e9 != false) {
      local_27f4[1] = 0;
      capnproto_test::capnp::test::TestAllTypes::Builder::getUInt8List
                ((Builder *)local_2820,(Builder *)local_21c0);
      local_27f4[0] = List<unsigned_char,_(capnp::Kind)0>::Builder::size((Builder *)local_2820);
      kj::_::Debug::log<char_const(&)[53],int,unsigned_int>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
                 ,0x248,ERROR,
                 "\"failed: expected \" \"(0) == (root.getUInt8List().size())\", 0, root.getUInt8List().size()"
                 ,(char (*) [53])"failed: expected (0) == (root.getUInt8List().size())",
                 (int *)(local_27f4 + 1),local_27f4);
      local_27e9 = false;
    }
  }
  bVar2 = capnproto_test::capnp::test::TestAllTypes::Builder::hasUInt16List((Builder *)local_21c0);
  if (!bVar2) {
    local_2821 = kj::_::Debug::shouldLog(ERROR);
    while (local_2821 != false) {
      kj::_::Debug::log<char_const(&)[38]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
                 ,0x248,ERROR,"\"failed: expected \" \"root.hasUInt16List()\"",
                 (char (*) [38])"failed: expected root.hasUInt16List()");
      local_2821 = false;
    }
  }
  capnproto_test::capnp::test::TestAllTypes::Builder::getUInt16List
            ((Builder *)local_2850,(Builder *)local_21c0);
  uVar3 = List<unsigned_short,_(capnp::Kind)0>::Builder::size((Builder *)local_2850);
  if (uVar3 != 0) {
    local_2851 = kj::_::Debug::shouldLog(ERROR);
    while (local_2851 != false) {
      local_285c[1] = 0;
      capnproto_test::capnp::test::TestAllTypes::Builder::getUInt16List
                ((Builder *)local_2888,(Builder *)local_21c0);
      local_285c[0] = List<unsigned_short,_(capnp::Kind)0>::Builder::size((Builder *)local_2888);
      kj::_::Debug::log<char_const(&)[54],int,unsigned_int>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
                 ,0x248,ERROR,
                 "\"failed: expected \" \"(0) == (root.getUInt16List().size())\", 0, root.getUInt16List().size()"
                 ,(char (*) [54])"failed: expected (0) == (root.getUInt16List().size())",
                 (int *)(local_285c + 1),local_285c);
      local_2851 = false;
    }
  }
  bVar2 = capnproto_test::capnp::test::TestAllTypes::Builder::hasUInt32List((Builder *)local_21c0);
  if (!bVar2) {
    local_2889 = kj::_::Debug::shouldLog(ERROR);
    while (local_2889 != false) {
      kj::_::Debug::log<char_const(&)[38]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
                 ,0x248,ERROR,"\"failed: expected \" \"root.hasUInt32List()\"",
                 (char (*) [38])"failed: expected root.hasUInt32List()");
      local_2889 = false;
    }
  }
  capnproto_test::capnp::test::TestAllTypes::Builder::getUInt32List
            ((Builder *)local_28b8,(Builder *)local_21c0);
  uVar3 = List<unsigned_int,_(capnp::Kind)0>::Builder::size((Builder *)local_28b8);
  if (uVar3 != 0) {
    local_28b9 = kj::_::Debug::shouldLog(ERROR);
    while (local_28b9 != false) {
      local_28c4[1] = 0;
      capnproto_test::capnp::test::TestAllTypes::Builder::getUInt32List
                ((Builder *)local_28f0,(Builder *)local_21c0);
      local_28c4[0] = List<unsigned_int,_(capnp::Kind)0>::Builder::size((Builder *)local_28f0);
      kj::_::Debug::log<char_const(&)[54],int,unsigned_int>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
                 ,0x248,ERROR,
                 "\"failed: expected \" \"(0) == (root.getUInt32List().size())\", 0, root.getUInt32List().size()"
                 ,(char (*) [54])"failed: expected (0) == (root.getUInt32List().size())",
                 (int *)(local_28c4 + 1),local_28c4);
      local_28b9 = false;
    }
  }
  bVar2 = capnproto_test::capnp::test::TestAllTypes::Builder::hasUInt64List((Builder *)local_21c0);
  if (!bVar2) {
    local_28f1 = kj::_::Debug::shouldLog(ERROR);
    while (local_28f1 != false) {
      kj::_::Debug::log<char_const(&)[38]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
                 ,0x248,ERROR,"\"failed: expected \" \"root.hasUInt64List()\"",
                 (char (*) [38])"failed: expected root.hasUInt64List()");
      local_28f1 = false;
    }
  }
  capnproto_test::capnp::test::TestAllTypes::Builder::getUInt64List
            ((Builder *)local_2920,(Builder *)local_21c0);
  uVar3 = List<unsigned_long,_(capnp::Kind)0>::Builder::size((Builder *)local_2920);
  if (uVar3 != 0) {
    local_2921 = kj::_::Debug::shouldLog(ERROR);
    while (local_2921 != false) {
      local_292c[1] = 0;
      capnproto_test::capnp::test::TestAllTypes::Builder::getUInt64List
                ((Builder *)local_2958,(Builder *)local_21c0);
      local_292c[0] = List<unsigned_long,_(capnp::Kind)0>::Builder::size((Builder *)local_2958);
      kj::_::Debug::log<char_const(&)[54],int,unsigned_int>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
                 ,0x248,ERROR,
                 "\"failed: expected \" \"(0) == (root.getUInt64List().size())\", 0, root.getUInt64List().size()"
                 ,(char (*) [54])"failed: expected (0) == (root.getUInt64List().size())",
                 (int *)(local_292c + 1),local_292c);
      local_2921 = false;
    }
  }
  bVar2 = capnproto_test::capnp::test::TestAllTypes::Builder::hasInt8List((Builder *)local_21c0);
  if (!bVar2) {
    local_2959 = kj::_::Debug::shouldLog(ERROR);
    while (local_2959 != false) {
      kj::_::Debug::log<char_const(&)[36]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
                 ,0x248,ERROR,"\"failed: expected \" \"root.hasInt8List()\"",
                 (char (*) [36])"failed: expected root.hasInt8List()");
      local_2959 = false;
    }
  }
  capnproto_test::capnp::test::TestAllTypes::Builder::getInt8List
            ((Builder *)local_2988,(Builder *)local_21c0);
  uVar3 = List<signed_char,_(capnp::Kind)0>::Builder::size((Builder *)local_2988);
  if (uVar3 != 0) {
    local_2989 = kj::_::Debug::shouldLog(ERROR);
    while (local_2989 != false) {
      local_2994[1] = 0;
      capnproto_test::capnp::test::TestAllTypes::Builder::getInt8List
                ((Builder *)local_29c0,(Builder *)local_21c0);
      local_2994[0] = List<signed_char,_(capnp::Kind)0>::Builder::size((Builder *)local_29c0);
      kj::_::Debug::log<char_const(&)[52],int,unsigned_int>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
                 ,0x248,ERROR,
                 "\"failed: expected \" \"(0) == (root.getInt8List().size())\", 0, root.getInt8List().size()"
                 ,(char (*) [52])"failed: expected (0) == (root.getInt8List().size())",
                 (int *)(local_2994 + 1),local_2994);
      local_2989 = false;
    }
  }
  bVar2 = capnproto_test::capnp::test::TestAllTypes::Builder::hasInt16List((Builder *)local_21c0);
  if (!bVar2) {
    local_29c1 = kj::_::Debug::shouldLog(ERROR);
    while (local_29c1 != false) {
      kj::_::Debug::log<char_const(&)[37]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
                 ,0x248,ERROR,"\"failed: expected \" \"root.hasInt16List()\"",
                 (char (*) [37])"failed: expected root.hasInt16List()");
      local_29c1 = false;
    }
  }
  capnproto_test::capnp::test::TestAllTypes::Builder::getInt16List
            ((Builder *)local_29f0,(Builder *)local_21c0);
  uVar3 = List<short,_(capnp::Kind)0>::Builder::size((Builder *)local_29f0);
  if (uVar3 != 0) {
    local_29f1 = kj::_::Debug::shouldLog(ERROR);
    while (local_29f1 != false) {
      local_29fc[1] = 0;
      capnproto_test::capnp::test::TestAllTypes::Builder::getInt16List
                ((Builder *)local_2a28,(Builder *)local_21c0);
      local_29fc[0] = List<short,_(capnp::Kind)0>::Builder::size((Builder *)local_2a28);
      kj::_::Debug::log<char_const(&)[53],int,unsigned_int>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
                 ,0x248,ERROR,
                 "\"failed: expected \" \"(0) == (root.getInt16List().size())\", 0, root.getInt16List().size()"
                 ,(char (*) [53])"failed: expected (0) == (root.getInt16List().size())",
                 (int *)(local_29fc + 1),local_29fc);
      local_29f1 = false;
    }
  }
  bVar2 = capnproto_test::capnp::test::TestAllTypes::Builder::hasInt32List((Builder *)local_21c0);
  if (!bVar2) {
    local_2a29 = kj::_::Debug::shouldLog(ERROR);
    while (local_2a29 != false) {
      kj::_::Debug::log<char_const(&)[37]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
                 ,0x248,ERROR,"\"failed: expected \" \"root.hasInt32List()\"",
                 (char (*) [37])"failed: expected root.hasInt32List()");
      local_2a29 = false;
    }
  }
  capnproto_test::capnp::test::TestAllTypes::Builder::getInt32List
            ((Builder *)local_2a58,(Builder *)local_21c0);
  uVar3 = List<int,_(capnp::Kind)0>::Builder::size((Builder *)local_2a58);
  if (uVar3 != 0) {
    local_2a59 = kj::_::Debug::shouldLog(ERROR);
    while (local_2a59 != false) {
      local_2a64[1] = 0;
      capnproto_test::capnp::test::TestAllTypes::Builder::getInt32List
                ((Builder *)local_2a90,(Builder *)local_21c0);
      local_2a64[0] = List<int,_(capnp::Kind)0>::Builder::size((Builder *)local_2a90);
      kj::_::Debug::log<char_const(&)[53],int,unsigned_int>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
                 ,0x248,ERROR,
                 "\"failed: expected \" \"(0) == (root.getInt32List().size())\", 0, root.getInt32List().size()"
                 ,(char (*) [53])"failed: expected (0) == (root.getInt32List().size())",
                 (int *)(local_2a64 + 1),local_2a64);
      local_2a59 = false;
    }
  }
  bVar2 = capnproto_test::capnp::test::TestAllTypes::Builder::hasInt64List((Builder *)local_21c0);
  if (!bVar2) {
    local_2a91 = kj::_::Debug::shouldLog(ERROR);
    while (local_2a91 != false) {
      kj::_::Debug::log<char_const(&)[37]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
                 ,0x248,ERROR,"\"failed: expected \" \"root.hasInt64List()\"",
                 (char (*) [37])"failed: expected root.hasInt64List()");
      local_2a91 = false;
    }
  }
  capnproto_test::capnp::test::TestAllTypes::Builder::getInt64List
            ((Builder *)local_2ac0,(Builder *)local_21c0);
  uVar3 = List<long,_(capnp::Kind)0>::Builder::size((Builder *)local_2ac0);
  if (uVar3 != 0) {
    local_2ac1 = kj::_::Debug::shouldLog(ERROR);
    while (local_2ac1 != false) {
      local_2acc[1] = 0;
      capnproto_test::capnp::test::TestAllTypes::Builder::getInt64List
                ((Builder *)local_2af8,(Builder *)local_21c0);
      local_2acc[0] = List<long,_(capnp::Kind)0>::Builder::size((Builder *)local_2af8);
      kj::_::Debug::log<char_const(&)[53],int,unsigned_int>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
                 ,0x248,ERROR,
                 "\"failed: expected \" \"(0) == (root.getInt64List().size())\", 0, root.getInt64List().size()"
                 ,(char (*) [53])"failed: expected (0) == (root.getInt64List().size())",
                 (int *)(local_2acc + 1),local_2acc);
      local_2ac1 = false;
    }
  }
  bVar2 = capnproto_test::capnp::test::TestAllTypes::Builder::hasFloat32List((Builder *)local_21c0);
  if (!bVar2) {
    local_2af9 = kj::_::Debug::shouldLog(ERROR);
    while (local_2af9 != false) {
      kj::_::Debug::log<char_const(&)[39]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
                 ,0x248,ERROR,"\"failed: expected \" \"root.hasFloat32List()\"",
                 (char (*) [39])"failed: expected root.hasFloat32List()");
      local_2af9 = false;
    }
  }
  capnproto_test::capnp::test::TestAllTypes::Builder::getFloat32List
            ((Builder *)local_2b28,(Builder *)local_21c0);
  uVar3 = List<float,_(capnp::Kind)0>::Builder::size((Builder *)local_2b28);
  if (uVar3 != 0) {
    local_2b29 = kj::_::Debug::shouldLog(ERROR);
    while (local_2b29 != false) {
      local_2b34[1] = 0;
      capnproto_test::capnp::test::TestAllTypes::Builder::getFloat32List
                ((Builder *)local_2b60,(Builder *)local_21c0);
      local_2b34[0] = List<float,_(capnp::Kind)0>::Builder::size((Builder *)local_2b60);
      kj::_::Debug::log<char_const(&)[55],int,unsigned_int>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
                 ,0x248,ERROR,
                 "\"failed: expected \" \"(0) == (root.getFloat32List().size())\", 0, root.getFloat32List().size()"
                 ,(char (*) [55])"failed: expected (0) == (root.getFloat32List().size())",
                 (int *)(local_2b34 + 1),local_2b34);
      local_2b29 = false;
    }
  }
  bVar2 = capnproto_test::capnp::test::TestAllTypes::Builder::hasFloat64List((Builder *)local_21c0);
  if (!bVar2) {
    local_2b61 = kj::_::Debug::shouldLog(ERROR);
    while (local_2b61 != false) {
      kj::_::Debug::log<char_const(&)[39]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
                 ,0x248,ERROR,"\"failed: expected \" \"root.hasFloat64List()\"",
                 (char (*) [39])"failed: expected root.hasFloat64List()");
      local_2b61 = false;
    }
  }
  capnproto_test::capnp::test::TestAllTypes::Builder::getFloat64List
            ((Builder *)local_2b90,(Builder *)local_21c0);
  uVar3 = List<double,_(capnp::Kind)0>::Builder::size((Builder *)local_2b90);
  if (uVar3 != 0) {
    local_2b91 = kj::_::Debug::shouldLog(ERROR);
    while (local_2b91 != false) {
      local_2b9c[1] = 0;
      capnproto_test::capnp::test::TestAllTypes::Builder::getFloat64List
                ((Builder *)local_2bc8,(Builder *)local_21c0);
      local_2b9c[0] = List<double,_(capnp::Kind)0>::Builder::size((Builder *)local_2bc8);
      kj::_::Debug::log<char_const(&)[55],int,unsigned_int>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
                 ,0x248,ERROR,
                 "\"failed: expected \" \"(0) == (root.getFloat64List().size())\", 0, root.getFloat64List().size()"
                 ,(char (*) [55])"failed: expected (0) == (root.getFloat64List().size())",
                 (int *)(local_2b9c + 1),local_2b9c);
      local_2b91 = false;
    }
  }
  bVar2 = capnproto_test::capnp::test::TestAllTypes::Builder::hasTextList((Builder *)local_21c0);
  if (!bVar2) {
    local_2bc9 = kj::_::Debug::shouldLog(ERROR);
    while (local_2bc9 != false) {
      kj::_::Debug::log<char_const(&)[36]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
                 ,0x248,ERROR,"\"failed: expected \" \"root.hasTextList()\"",
                 (char (*) [36])"failed: expected root.hasTextList()");
      local_2bc9 = false;
    }
  }
  capnproto_test::capnp::test::TestAllTypes::Builder::getTextList
            ((Builder *)local_2bf8,(Builder *)local_21c0);
  uVar3 = List<capnp::Text,_(capnp::Kind)1>::Builder::size((Builder *)local_2bf8);
  if (uVar3 != 0) {
    local_2bf9 = kj::_::Debug::shouldLog(ERROR);
    while (local_2bf9 != false) {
      local_2c04[1] = 0;
      capnproto_test::capnp::test::TestAllTypes::Builder::getTextList
                ((Builder *)local_2c30,(Builder *)local_21c0);
      local_2c04[0] = List<capnp::Text,_(capnp::Kind)1>::Builder::size((Builder *)local_2c30);
      kj::_::Debug::log<char_const(&)[52],int,unsigned_int>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
                 ,0x248,ERROR,
                 "\"failed: expected \" \"(0) == (root.getTextList().size())\", 0, root.getTextList().size()"
                 ,(char (*) [52])"failed: expected (0) == (root.getTextList().size())",
                 (int *)(local_2c04 + 1),local_2c04);
      local_2bf9 = false;
    }
  }
  bVar2 = capnproto_test::capnp::test::TestAllTypes::Builder::hasDataList((Builder *)local_21c0);
  if (!bVar2) {
    local_2c31 = kj::_::Debug::shouldLog(ERROR);
    while (local_2c31 != false) {
      kj::_::Debug::log<char_const(&)[36]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
                 ,0x248,ERROR,"\"failed: expected \" \"root.hasDataList()\"",
                 (char (*) [36])"failed: expected root.hasDataList()");
      local_2c31 = false;
    }
  }
  capnproto_test::capnp::test::TestAllTypes::Builder::getDataList
            ((Builder *)local_2c60,(Builder *)local_21c0);
  uVar3 = List<capnp::Data,_(capnp::Kind)1>::Builder::size((Builder *)local_2c60);
  if (uVar3 != 0) {
    local_2c61 = kj::_::Debug::shouldLog(ERROR);
    while (local_2c61 != false) {
      local_2c6c[1] = 0;
      capnproto_test::capnp::test::TestAllTypes::Builder::getDataList
                ((Builder *)local_2c98,(Builder *)local_21c0);
      local_2c6c[0] = List<capnp::Data,_(capnp::Kind)1>::Builder::size((Builder *)local_2c98);
      kj::_::Debug::log<char_const(&)[52],int,unsigned_int>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
                 ,0x248,ERROR,
                 "\"failed: expected \" \"(0) == (root.getDataList().size())\", 0, root.getDataList().size()"
                 ,(char (*) [52])"failed: expected (0) == (root.getDataList().size())",
                 (int *)(local_2c6c + 1),local_2c6c);
      local_2c61 = false;
    }
  }
  bVar2 = capnproto_test::capnp::test::TestAllTypes::Builder::hasStructList((Builder *)local_21c0);
  if (!bVar2) {
    local_2c99 = kj::_::Debug::shouldLog(ERROR);
    while (local_2c99 != false) {
      kj::_::Debug::log<char_const(&)[38]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
                 ,0x248,ERROR,"\"failed: expected \" \"root.hasStructList()\"",
                 (char (*) [38])"failed: expected root.hasStructList()");
      local_2c99 = false;
    }
  }
  capnproto_test::capnp::test::TestAllTypes::Builder::getStructList
            ((Builder *)local_2cc8,(Builder *)local_21c0);
  uVar3 = List<capnproto_test::capnp::test::TestAllTypes,_(capnp::Kind)3>::Builder::size
                    ((Builder *)local_2cc8);
  if (uVar3 != 0) {
    local_2cc9 = kj::_::Debug::shouldLog(ERROR);
    while (local_2cc9 != false) {
      local_2cd4[1] = 0;
      capnproto_test::capnp::test::TestAllTypes::Builder::getStructList
                (&local_2d00,(Builder *)local_21c0);
      local_2cd4[0] =
           List<capnproto_test::capnp::test::TestAllTypes,_(capnp::Kind)3>::Builder::size
                     (&local_2d00);
      kj::_::Debug::log<char_const(&)[54],int,unsigned_int>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
                 ,0x248,ERROR,
                 "\"failed: expected \" \"(0) == (root.getStructList().size())\", 0, root.getStructList().size()"
                 ,(char (*) [54])"failed: expected (0) == (root.getStructList().size())",
                 (int *)(local_2cd4 + 1),local_2cd4);
      local_2cc9 = false;
    }
  }
  MallocMessageBuilder::~MallocMessageBuilder((MallocMessageBuilder *)&root_3._builder.dataSize);
  return;
}

Assistant:

TEST(Encoding, SetListToEmpty) {
  // Test initializing list fields from various ways of constructing zero-sized lists.
  // At one point this would often fail because the lists would have ElementSize::VOID which is
  // incompatible with other list sizes.

#define ALL_LIST_TYPES(MACRO) \
  MACRO(Void, Void) \
  MACRO(Bool, bool) \
  MACRO(UInt8, uint8_t) \
  MACRO(UInt16, uint16_t) \
  MACRO(UInt32, uint32_t) \
  MACRO(UInt64, uint64_t) \
  MACRO(Int8, int8_t) \
  MACRO(Int16, int16_t) \
  MACRO(Int32, int32_t) \
  MACRO(Int64, int64_t) \
  MACRO(Float32, float) \
  MACRO(Float64, double) \
  MACRO(Text, Text) \
  MACRO(Data, Data) \
  MACRO(Struct, TestAllTypes)

#define SET_FROM_READER_ACCESSOR(name, type) \
  root.set##name##List(reader.get##name##List());

#define SET_FROM_BUILDER_ACCESSOR(name, type) \
  root.set##name##List(root.get##name##List());

#define SET_FROM_READER_CONSTRUCTOR(name, type) \
  root.set##name##List(List<type>::Reader());

#define SET_FROM_BUILDER_CONSTRUCTOR(name, type) \
  root.set##name##List(List<type>::Builder());

#define CHECK_EMPTY_NONNULL(name, type) \
  EXPECT_TRUE(root.has##name##List()); \
  EXPECT_EQ(0, root.get##name##List().size());

  {
    MallocMessageBuilder builder;
    auto root = builder.initRoot<test::TestAllTypes>();
    auto reader = root.asReader();
    ALL_LIST_TYPES(SET_FROM_READER_ACCESSOR)
    ALL_LIST_TYPES(CHECK_EMPTY_NONNULL)
  }

  {
    MallocMessageBuilder builder;
    auto root = builder.initRoot<test::TestAllTypes>();
    ALL_LIST_TYPES(SET_FROM_BUILDER_ACCESSOR)
    ALL_LIST_TYPES(CHECK_EMPTY_NONNULL)
  }

  {
    MallocMessageBuilder builder;
    auto root = builder.initRoot<test::TestAllTypes>();
    ALL_LIST_TYPES(SET_FROM_READER_CONSTRUCTOR)
    ALL_LIST_TYPES(CHECK_EMPTY_NONNULL)
  }

  {
    MallocMessageBuilder builder;
    auto root = builder.initRoot<test::TestAllTypes>();
    ALL_LIST_TYPES(SET_FROM_BUILDER_CONSTRUCTOR)
    ALL_LIST_TYPES(CHECK_EMPTY_NONNULL)
  }

#undef SET_FROM_READER_ACCESSOR
#undef SET_FROM_BUILDER_ACCESSOR
#undef SET_FROM_READER_CONSTRUCTOR
#undef SET_FROM_BUILDER_CONSTRUCTOR
#undef CHECK_EMPTY_NONNULL
}